

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  RayQueryContext *pRVar59;
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  long lVar64;
  byte bVar65;
  uint uVar66;
  uint uVar67;
  ulong uVar68;
  bool bVar69;
  ulong uVar70;
  bool bVar71;
  float t1;
  float fVar72;
  undefined4 uVar73;
  float fVar74;
  float fVar92;
  float fVar94;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar93;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar95;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar96;
  undefined8 uVar97;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar152;
  vfloat4 b0;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar166;
  float fVar183;
  float fVar184;
  vfloat4 b0_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar185;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  float fVar198;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar189 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar199;
  undefined1 auVar197 [32];
  float fVar203;
  float fVar204;
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar216;
  float fVar231;
  vfloat4 a0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar232;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [64];
  vfloat4 a0_3;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar250;
  vfloat4 a0_1;
  undefined1 auVar254 [16];
  undefined1 auVar251 [16];
  float fVar265;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar264;
  undefined1 in_ZMM12 [64];
  undefined1 auVar262 [64];
  vfloat4 a0;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar294 [32];
  vfloat_impl<4> p03;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_648 [8];
  undefined8 uStack_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined1 local_608 [32];
  undefined1 local_548 [32];
  undefined1 local_518 [16];
  undefined1 (*local_508) [16];
  RayQueryContext *local_500;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 auStack_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  uint auStack_3e8 [4];
  RTCFilterFunctionNArguments local_3d8;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  uint uStack_228;
  float afStack_224 [7];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  undefined4 uStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar63;
  undefined1 auVar293 [32];
  
  PVar7 = prim[1];
  uVar70 = (ulong)(byte)PVar7;
  fVar72 = *(float *)(prim + uVar70 * 0x19 + 0x12);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar12 = vsubps_avx(auVar12,*(undefined1 (*) [16])(prim + uVar70 * 0x19 + 6));
  auVar75._0_4_ = fVar72 * auVar12._0_4_;
  auVar75._4_4_ = fVar72 * auVar12._4_4_;
  auVar75._8_4_ = fVar72 * auVar12._8_4_;
  auVar75._12_4_ = fVar72 * auVar12._12_4_;
  auVar186._0_4_ = fVar72 * auVar13._0_4_;
  auVar186._4_4_ = fVar72 * auVar13._4_4_;
  auVar186._8_4_ = fVar72 * auVar13._8_4_;
  auVar186._12_4_ = fVar72 * auVar13._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar70 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar12);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar70 * 5 + 6);
  auVar14 = vpmovsxbd_avx2(auVar13);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar288._8_8_ = 0;
  auVar288._0_8_ = *(ulong *)(prim + uVar70 * 6 + 6);
  auVar15 = vpmovsxbd_avx2(auVar288);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar70 * 0xb + 6);
  auVar16 = vpmovsxbd_avx2(auVar3);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar7 * 0xc) + 6);
  auVar17 = vpmovsxbd_avx2(auVar4);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (uint)(byte)PVar7 * 0xc + uVar70 + 6);
  auVar18 = vpmovsxbd_avx2(auVar5);
  auVar18 = vcvtdq2ps_avx(auVar18);
  uVar62 = (ulong)(uint)((int)(uVar70 * 9) * 2);
  auVar254._8_8_ = 0;
  auVar254._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar19 = vpmovsxbd_avx2(auVar254);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = *(ulong *)(prim + uVar62 + uVar70 + 6);
  auVar20 = vpmovsxbd_avx2(auVar234);
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar62 = (ulong)(uint)((int)(uVar70 * 5) << 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar62 + 6);
  auVar261 = vpmovsxbd_avx2(auVar6);
  auVar261 = vcvtdq2ps_avx(auVar261);
  auVar280._4_4_ = auVar186._0_4_;
  auVar280._0_4_ = auVar186._0_4_;
  auVar280._8_4_ = auVar186._0_4_;
  auVar280._12_4_ = auVar186._0_4_;
  auVar280._16_4_ = auVar186._0_4_;
  auVar280._20_4_ = auVar186._0_4_;
  auVar280._24_4_ = auVar186._0_4_;
  auVar280._28_4_ = auVar186._0_4_;
  auVar12 = vmovshdup_avx(auVar186);
  uVar97 = auVar12._0_8_;
  auVar291._8_8_ = uVar97;
  auVar291._0_8_ = uVar97;
  auVar291._16_8_ = uVar97;
  auVar291._24_8_ = uVar97;
  auVar12 = vshufps_avx(auVar186,auVar186,0xaa);
  fVar72 = auVar12._0_4_;
  auVar262._0_4_ = fVar72 * auVar15._0_4_;
  fVar92 = auVar12._4_4_;
  auVar262._4_4_ = fVar92 * auVar15._4_4_;
  auVar262._8_4_ = fVar72 * auVar15._8_4_;
  auVar262._12_4_ = fVar92 * auVar15._12_4_;
  auVar262._16_4_ = fVar72 * auVar15._16_4_;
  auVar262._20_4_ = fVar92 * auVar15._20_4_;
  auVar262._28_36_ = in_ZMM12._28_36_;
  auVar262._24_4_ = fVar72 * auVar15._24_4_;
  auVar230._0_4_ = auVar18._0_4_ * fVar72;
  auVar230._4_4_ = auVar18._4_4_ * fVar92;
  auVar230._8_4_ = auVar18._8_4_ * fVar72;
  auVar230._12_4_ = auVar18._12_4_ * fVar92;
  auVar230._16_4_ = auVar18._16_4_ * fVar72;
  auVar230._20_4_ = auVar18._20_4_ * fVar92;
  auVar230._28_36_ = in_ZMM10._28_36_;
  auVar230._24_4_ = auVar18._24_4_ * fVar72;
  auVar228._0_4_ = auVar261._0_4_ * fVar72;
  auVar228._4_4_ = auVar261._4_4_ * fVar92;
  auVar228._8_4_ = auVar261._8_4_ * fVar72;
  auVar228._12_4_ = auVar261._12_4_ * fVar92;
  auVar228._16_4_ = auVar261._16_4_ * fVar72;
  auVar228._20_4_ = auVar261._20_4_ * fVar92;
  auVar228._24_4_ = auVar261._24_4_ * fVar72;
  auVar228._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(auVar262._0_32_,auVar291,auVar14);
  auVar13 = vfmadd231ps_fma(auVar230._0_32_,auVar291,auVar17);
  auVar288 = vfmadd231ps_fma(auVar228,auVar20,auVar291);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar280,auVar88);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar280,auVar16);
  auVar288 = vfmadd231ps_fma(ZEXT1632(auVar288),auVar19,auVar280);
  auVar281._4_4_ = auVar75._0_4_;
  auVar281._0_4_ = auVar75._0_4_;
  auVar281._8_4_ = auVar75._0_4_;
  auVar281._12_4_ = auVar75._0_4_;
  auVar281._16_4_ = auVar75._0_4_;
  auVar281._20_4_ = auVar75._0_4_;
  auVar281._24_4_ = auVar75._0_4_;
  auVar281._28_4_ = auVar75._0_4_;
  auVar12 = vmovshdup_avx(auVar75);
  uVar97 = auVar12._0_8_;
  auVar292._8_8_ = uVar97;
  auVar292._0_8_ = uVar97;
  auVar292._16_8_ = uVar97;
  auVar292._24_8_ = uVar97;
  auVar12 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar72 = auVar12._0_4_;
  auVar193._0_4_ = fVar72 * auVar15._0_4_;
  fVar92 = auVar12._4_4_;
  auVar193._4_4_ = fVar92 * auVar15._4_4_;
  auVar193._8_4_ = fVar72 * auVar15._8_4_;
  auVar193._12_4_ = fVar92 * auVar15._12_4_;
  auVar193._16_4_ = fVar72 * auVar15._16_4_;
  auVar193._20_4_ = fVar92 * auVar15._20_4_;
  auVar193._24_4_ = fVar72 * auVar15._24_4_;
  auVar193._28_4_ = 0;
  auVar23._4_4_ = auVar18._4_4_ * fVar92;
  auVar23._0_4_ = auVar18._0_4_ * fVar72;
  auVar23._8_4_ = auVar18._8_4_ * fVar72;
  auVar23._12_4_ = auVar18._12_4_ * fVar92;
  auVar23._16_4_ = auVar18._16_4_ * fVar72;
  auVar23._20_4_ = auVar18._20_4_ * fVar92;
  auVar23._24_4_ = auVar18._24_4_ * fVar72;
  auVar23._28_4_ = auVar15._28_4_;
  auVar15._4_4_ = auVar261._4_4_ * fVar92;
  auVar15._0_4_ = auVar261._0_4_ * fVar72;
  auVar15._8_4_ = auVar261._8_4_ * fVar72;
  auVar15._12_4_ = auVar261._12_4_ * fVar92;
  auVar15._16_4_ = auVar261._16_4_ * fVar72;
  auVar15._20_4_ = auVar261._20_4_ * fVar92;
  auVar15._24_4_ = auVar261._24_4_ * fVar72;
  auVar15._28_4_ = fVar92;
  auVar12 = vfmadd231ps_fma(auVar193,auVar292,auVar14);
  auVar4 = vfmadd231ps_fma(auVar23,auVar292,auVar17);
  auVar5 = vfmadd231ps_fma(auVar15,auVar292,auVar20);
  auVar254 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar281,auVar88);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar281,auVar16);
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  auVar149._8_4_ = 0x219392ef;
  auVar149._0_8_ = 0x219392ef219392ef;
  auVar149._12_4_ = 0x219392ef;
  auVar149._16_4_ = 0x219392ef;
  auVar149._20_4_ = 0x219392ef;
  auVar149._24_4_ = 0x219392ef;
  auVar149._28_4_ = 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar3),auVar126);
  auVar88 = vcmpps_avx(auVar88,auVar149,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar3),auVar149,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar13),auVar126);
  auVar88 = vcmpps_avx(auVar88,auVar149,1);
  auVar15 = vblendvps_avx(ZEXT1632(auVar13),auVar149,auVar88);
  auVar88 = vandps_avx(ZEXT1632(auVar288),auVar126);
  auVar88 = vcmpps_avx(auVar88,auVar149,1);
  auVar88 = vblendvps_avx(ZEXT1632(auVar288),auVar149,auVar88);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar281,auVar19);
  auVar16 = vrcpps_avx(auVar14);
  auVar164._8_4_ = 0x3f800000;
  auVar164._0_8_ = 0x3f8000003f800000;
  auVar164._12_4_ = 0x3f800000;
  auVar164._16_4_ = 0x3f800000;
  auVar164._20_4_ = 0x3f800000;
  auVar164._24_4_ = 0x3f800000;
  auVar164._28_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar14,auVar16,auVar164);
  auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar13 = vfnmadd213ps_fma(auVar15,auVar14,auVar164);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar88);
  auVar288 = vfnmadd213ps_fma(auVar88,auVar14,auVar164);
  auVar288 = vfmadd132ps_fma(ZEXT1632(auVar288),auVar14,auVar14);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar254));
  auVar16._4_4_ = auVar12._4_4_ * auVar88._4_4_;
  auVar16._0_4_ = auVar12._0_4_ * auVar88._0_4_;
  auVar16._8_4_ = auVar12._8_4_ * auVar88._8_4_;
  auVar16._12_4_ = auVar12._12_4_ * auVar88._12_4_;
  auVar16._16_4_ = auVar88._16_4_ * 0.0;
  auVar16._20_4_ = auVar88._20_4_ * 0.0;
  auVar16._24_4_ = auVar88._24_4_ * 0.0;
  auVar16._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar254));
  auVar17._4_4_ = auVar12._4_4_ * auVar88._4_4_;
  auVar17._0_4_ = auVar12._0_4_ * auVar88._0_4_;
  auVar17._8_4_ = auVar12._8_4_ * auVar88._8_4_;
  auVar17._12_4_ = auVar12._12_4_ * auVar88._12_4_;
  auVar17._16_4_ = auVar88._16_4_ * 0.0;
  auVar17._20_4_ = auVar88._20_4_ * 0.0;
  auVar17._24_4_ = auVar88._24_4_ * 0.0;
  auVar17._28_4_ = auVar88._28_4_;
  auVar110._1_3_ = 0;
  auVar110[0] = PVar7;
  auVar14 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar7 * 0x10 + 6));
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar7 * 0x10 + uVar70 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar4));
  auVar18._4_4_ = auVar88._4_4_ * auVar13._4_4_;
  auVar18._0_4_ = auVar88._0_4_ * auVar13._0_4_;
  auVar18._8_4_ = auVar88._8_4_ * auVar13._8_4_;
  auVar18._12_4_ = auVar88._12_4_ * auVar13._12_4_;
  auVar18._16_4_ = auVar88._16_4_ * 0.0;
  auVar18._20_4_ = auVar88._20_4_ * 0.0;
  auVar18._24_4_ = auVar88._24_4_ * 0.0;
  auVar18._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar14);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar4));
  auVar19._4_4_ = auVar13._4_4_ * auVar88._4_4_;
  auVar19._0_4_ = auVar13._0_4_ * auVar88._0_4_;
  auVar19._8_4_ = auVar13._8_4_ * auVar88._8_4_;
  auVar19._12_4_ = auVar13._12_4_ * auVar88._12_4_;
  auVar19._16_4_ = auVar88._16_4_ * 0.0;
  auVar19._20_4_ = auVar88._20_4_ * 0.0;
  auVar19._24_4_ = auVar88._24_4_ * 0.0;
  auVar19._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 + uVar70 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar3));
  auVar20._4_4_ = auVar88._4_4_ * auVar288._4_4_;
  auVar20._0_4_ = auVar88._0_4_ * auVar288._0_4_;
  auVar20._8_4_ = auVar88._8_4_ * auVar288._8_4_;
  auVar20._12_4_ = auVar88._12_4_ * auVar288._12_4_;
  auVar20._16_4_ = auVar88._16_4_ * 0.0;
  auVar20._20_4_ = auVar88._20_4_ * 0.0;
  auVar20._24_4_ = auVar88._24_4_ * 0.0;
  auVar20._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar70 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar3));
  auVar261._4_4_ = auVar288._4_4_ * auVar88._4_4_;
  auVar261._0_4_ = auVar288._0_4_ * auVar88._0_4_;
  auVar261._8_4_ = auVar288._8_4_ * auVar88._8_4_;
  auVar261._12_4_ = auVar288._12_4_ * auVar88._12_4_;
  auVar261._16_4_ = auVar88._16_4_ * 0.0;
  auVar261._20_4_ = auVar88._20_4_ * 0.0;
  auVar261._24_4_ = auVar88._24_4_ * 0.0;
  auVar261._28_4_ = auVar88._28_4_;
  auVar88 = vpminsd_avx2(auVar16,auVar17);
  auVar14 = vpminsd_avx2(auVar18,auVar19);
  auVar88 = vmaxps_avx(auVar88,auVar14);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar194._4_4_ = uVar73;
  auVar194._0_4_ = uVar73;
  auVar194._8_4_ = uVar73;
  auVar194._12_4_ = uVar73;
  auVar194._16_4_ = uVar73;
  auVar194._20_4_ = uVar73;
  auVar194._24_4_ = uVar73;
  auVar194._28_4_ = uVar73;
  auVar14 = vpminsd_avx2(auVar20,auVar261);
  auVar14 = vmaxps_avx(auVar14,auVar194);
  auVar88 = vmaxps_avx(auVar88,auVar14);
  local_178._4_4_ = auVar88._4_4_ * 0.99999964;
  local_178._0_4_ = auVar88._0_4_ * 0.99999964;
  local_178._8_4_ = auVar88._8_4_ * 0.99999964;
  local_178._12_4_ = auVar88._12_4_ * 0.99999964;
  local_178._16_4_ = auVar88._16_4_ * 0.99999964;
  local_178._20_4_ = auVar88._20_4_ * 0.99999964;
  local_178._24_4_ = auVar88._24_4_ * 0.99999964;
  local_178._28_4_ = auVar14._28_4_;
  auVar88 = vpmaxsd_avx2(auVar16,auVar17);
  auVar14 = vpmaxsd_avx2(auVar18,auVar19);
  auVar88 = vminps_avx(auVar88,auVar14);
  auVar14 = vpmaxsd_avx2(auVar20,auVar261);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar127._4_4_ = uVar73;
  auVar127._0_4_ = uVar73;
  auVar127._8_4_ = uVar73;
  auVar127._12_4_ = uVar73;
  auVar127._16_4_ = uVar73;
  auVar127._20_4_ = uVar73;
  auVar127._24_4_ = uVar73;
  auVar127._28_4_ = uVar73;
  auVar14 = vminps_avx(auVar14,auVar127);
  auVar88 = vminps_avx(auVar88,auVar14);
  auVar24._4_4_ = auVar88._4_4_ * 1.0000004;
  auVar24._0_4_ = auVar88._0_4_ * 1.0000004;
  auVar24._8_4_ = auVar88._8_4_ * 1.0000004;
  auVar24._12_4_ = auVar88._12_4_ * 1.0000004;
  auVar24._16_4_ = auVar88._16_4_ * 1.0000004;
  auVar24._20_4_ = auVar88._20_4_ * 1.0000004;
  auVar24._24_4_ = auVar88._24_4_ * 1.0000004;
  auVar24._28_4_ = auVar88._28_4_;
  auVar110[4] = PVar7;
  auVar110._5_3_ = 0;
  auVar110[8] = PVar7;
  auVar110._9_3_ = 0;
  auVar110[0xc] = PVar7;
  auVar110._13_3_ = 0;
  auVar110[0x10] = PVar7;
  auVar110._17_3_ = 0;
  auVar110[0x14] = PVar7;
  auVar110._21_3_ = 0;
  auVar110[0x18] = PVar7;
  auVar110._25_3_ = 0;
  auVar110[0x1c] = PVar7;
  auVar110._29_3_ = 0;
  auVar14 = vpcmpgtd_avx2(auVar110,_DAT_01fe9900);
  auVar88 = vcmpps_avx(local_178,auVar24,2);
  auVar88 = vandps_avx(auVar88,auVar14);
  uVar60 = vmovmskps_avx(auVar88);
  if (uVar60 == 0) {
    return false;
  }
  uVar60 = uVar60 & 0xff;
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_508 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_500 = context;
LAB_017fe5c9:
  pRVar59 = local_500;
  lVar64 = 0;
  uVar70 = (ulong)uVar60;
  for (uVar62 = uVar70; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar64 = lVar64 + 1;
  }
  uVar60 = *(uint *)(prim + 2);
  local_368 = *(uint *)(prim + lVar64 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar60].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_368);
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar5 = *(undefined1 (*) [16])(_Var11 + uVar62 * (long)pvVar10);
  auVar12 = *(undefined1 (*) [16])(_Var11 + (uVar62 + 1) * (long)pvVar10);
  auVar13 = *(undefined1 (*) [16])(_Var11 + (uVar62 + 2) * (long)pvVar10);
  pfVar1 = (float *)(_Var11 + (long)pvVar10 * (uVar62 + 3));
  fVar72 = *pfVar1;
  fVar92 = pfVar1[1];
  fVar96 = pfVar1[2];
  fVar204 = pfVar1[3];
  lVar64 = *(long *)&pGVar8[1].time_range.upper;
  auVar288 = *(undefined1 (*) [16])(lVar64 + (long)p_Var9 * uVar62);
  auVar3 = *(undefined1 (*) [16])(lVar64 + (long)p_Var9 * (uVar62 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar64 + (long)p_Var9 * (uVar62 + 2));
  uVar70 = uVar70 - 1 & uVar70;
  pfVar1 = (float *)(lVar64 + (long)p_Var9 * (uVar62 + 3));
  fVar166 = *pfVar1;
  fVar183 = pfVar1[1];
  fVar184 = pfVar1[2];
  fVar185 = pfVar1[3];
  if (uVar70 != 0) {
    uVar68 = uVar70 - 1 & uVar70;
    for (uVar62 = uVar70; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    }
    if (uVar68 != 0) {
      for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar254 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar254 = vinsertps_avx(auVar254,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar284._8_4_ = 0x80000000;
  auVar284._0_8_ = 0x8000000080000000;
  auVar284._12_4_ = 0x80000000;
  auVar129._0_4_ = fVar166 * -0.0;
  auVar129._4_4_ = fVar183 * -0.0;
  auVar129._8_4_ = fVar184 * -0.0;
  auVar129._12_4_ = fVar185 * -0.0;
  auVar234 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar4,auVar129);
  auVar132._0_4_ = auVar3._0_4_ + auVar234._0_4_;
  auVar132._4_4_ = auVar3._4_4_ + auVar234._4_4_;
  auVar132._8_4_ = auVar3._8_4_ + auVar234._8_4_;
  auVar132._12_4_ = auVar3._12_4_ + auVar234._12_4_;
  auVar6 = vfmadd231ps_fma(auVar132,auVar288,auVar284);
  auVar245._12_4_ = 0;
  auVar245._0_12_ = ZEXT812(0);
  auVar245 = auVar245 << 0x20;
  auVar115._0_4_ = fVar166 * 0.0;
  auVar115._4_4_ = fVar183 * 0.0;
  auVar115._8_4_ = fVar184 * 0.0;
  auVar115._12_4_ = fVar185 * 0.0;
  auVar205._8_4_ = 0x3f000000;
  auVar205._0_8_ = 0x3f0000003f000000;
  auVar205._12_4_ = 0x3f000000;
  auVar234 = vfmadd231ps_fma(auVar115,auVar4,auVar205);
  auVar234 = vfmadd231ps_fma(auVar234,auVar3,auVar245);
  auVar77 = vfnmadd231ps_fma(auVar234,auVar288,auVar205);
  auVar276._0_4_ = fVar72 * -0.0;
  auVar276._4_4_ = fVar92 * -0.0;
  auVar276._8_4_ = fVar96 * -0.0;
  auVar276._12_4_ = fVar204 * -0.0;
  auVar234 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar13,auVar276);
  auVar266._0_4_ = auVar12._0_4_ + auVar234._0_4_;
  auVar266._4_4_ = auVar12._4_4_ + auVar234._4_4_;
  auVar266._8_4_ = auVar12._8_4_ + auVar234._8_4_;
  auVar266._12_4_ = auVar12._12_4_ + auVar234._12_4_;
  auVar234 = vfmadd231ps_fma(auVar266,auVar5,auVar284);
  auVar251._0_4_ = fVar72 * 0.0;
  auVar251._4_4_ = fVar92 * 0.0;
  auVar251._8_4_ = fVar96 * 0.0;
  auVar251._12_4_ = fVar204 * 0.0;
  auVar75 = vfmadd231ps_fma(auVar251,auVar13,auVar205);
  auVar75 = vfmadd231ps_fma(auVar75,auVar12,auVar245);
  auVar135 = vfnmadd231ps_fma(auVar75,auVar5,auVar205);
  auVar130._0_4_ = auVar4._0_4_ + auVar129._0_4_;
  auVar130._4_4_ = auVar4._4_4_ + auVar129._4_4_;
  auVar130._8_4_ = auVar4._8_4_ + auVar129._8_4_;
  auVar130._12_4_ = auVar4._12_4_ + auVar129._12_4_;
  auVar75 = vfmadd231ps_fma(auVar130,auVar3,auVar245);
  auVar75 = vfmadd231ps_fma(auVar75,auVar288,auVar284);
  auVar142._0_4_ = fVar166 * 0.5;
  auVar142._4_4_ = fVar183 * 0.5;
  auVar142._8_4_ = fVar184 * 0.5;
  auVar142._12_4_ = fVar185 * 0.5;
  auVar4 = vfmadd231ps_fma(auVar142,auVar245,auVar4);
  auVar3 = vfnmadd231ps_fma(auVar4,auVar205,auVar3);
  auVar186 = vfmadd231ps_fma(auVar3,auVar245,auVar288);
  auVar217._0_4_ = auVar276._0_4_ + auVar13._0_4_;
  auVar217._4_4_ = auVar276._4_4_ + auVar13._4_4_;
  auVar217._8_4_ = auVar276._8_4_ + auVar13._8_4_;
  auVar217._12_4_ = auVar276._12_4_ + auVar13._12_4_;
  auVar288 = vfmadd231ps_fma(auVar217,auVar12,auVar245);
  auVar4 = vfmadd231ps_fma(auVar288,auVar5,auVar284);
  auVar233._0_4_ = fVar72 * 0.5;
  auVar233._4_4_ = fVar92 * 0.5;
  auVar233._8_4_ = fVar96 * 0.5;
  auVar233._12_4_ = fVar204 * 0.5;
  auVar13 = vfmadd231ps_fma(auVar233,auVar245,auVar13);
  auVar12 = vfnmadd231ps_fma(auVar13,auVar205,auVar12);
  auVar5 = vfmadd231ps_fma(auVar12,auVar245,auVar5);
  auVar12 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar13 = vshufps_avx(auVar234,auVar234,0xc9);
  fVar128 = auVar77._0_4_;
  auVar167._0_4_ = fVar128 * auVar13._0_4_;
  fVar93 = auVar77._4_4_;
  auVar167._4_4_ = fVar93 * auVar13._4_4_;
  fVar94 = auVar77._8_4_;
  auVar167._8_4_ = fVar94 * auVar13._8_4_;
  fVar152 = auVar77._12_4_;
  auVar167._12_4_ = fVar152 * auVar13._12_4_;
  auVar13 = vfmsub231ps_fma(auVar167,auVar12,auVar234);
  auVar288 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar135,auVar135,0xc9);
  auVar168._0_4_ = fVar128 * auVar13._0_4_;
  auVar168._4_4_ = fVar93 * auVar13._4_4_;
  auVar168._8_4_ = fVar94 * auVar13._8_4_;
  auVar168._12_4_ = fVar152 * auVar13._12_4_;
  auVar12 = vfmsub231ps_fma(auVar168,auVar12,auVar135);
  auVar3 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar13 = vshufps_avx(auVar4,auVar4,0xc9);
  fVar74 = auVar186._0_4_;
  auVar153._0_4_ = fVar74 * auVar13._0_4_;
  fVar232 = auVar186._4_4_;
  auVar153._4_4_ = fVar232 * auVar13._4_4_;
  fVar141 = auVar186._8_4_;
  auVar153._8_4_ = fVar141 * auVar13._8_4_;
  fVar151 = auVar186._12_4_;
  auVar153._12_4_ = fVar151 * auVar13._12_4_;
  auVar13 = vfmsub231ps_fma(auVar153,auVar12,auVar4);
  auVar4 = vshufps_avx(auVar13,auVar13,0xc9);
  auVar13 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar187._0_4_ = fVar74 * auVar13._0_4_;
  auVar187._4_4_ = fVar232 * auVar13._4_4_;
  auVar187._8_4_ = fVar141 * auVar13._8_4_;
  auVar187._12_4_ = fVar151 * auVar13._12_4_;
  auVar12 = vfmsub231ps_fma(auVar187,auVar12,auVar5);
  auVar5 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vdpps_avx(auVar288,auVar288,0x7f);
  fVar92 = auVar12._0_4_;
  auVar234 = ZEXT416((uint)fVar92);
  auVar13 = vrsqrtss_avx(auVar234,auVar234);
  fVar72 = auVar13._0_4_;
  fVar72 = fVar72 * 1.5 + fVar92 * -0.5 * fVar72 * fVar72 * fVar72;
  auVar13 = vdpps_avx(auVar288,auVar3,0x7f);
  fVar166 = auVar288._0_4_ * fVar72;
  fVar183 = auVar288._4_4_ * fVar72;
  fVar184 = auVar288._8_4_ * fVar72;
  fVar185 = auVar288._12_4_ * fVar72;
  auVar244._0_4_ = auVar3._0_4_ * fVar92;
  auVar244._4_4_ = auVar3._4_4_ * fVar92;
  auVar244._8_4_ = auVar3._8_4_ * fVar92;
  auVar244._12_4_ = auVar3._12_4_ * fVar92;
  fVar92 = auVar13._0_4_;
  auVar206._0_4_ = auVar288._0_4_ * fVar92;
  auVar206._4_4_ = auVar288._4_4_ * fVar92;
  auVar206._8_4_ = auVar288._8_4_ * fVar92;
  auVar206._12_4_ = auVar288._12_4_ * fVar92;
  auVar288 = vsubps_avx(auVar244,auVar206);
  auVar13 = vrcpss_avx(auVar234,auVar234);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar13,SUB6416(ZEXT464(0x40000000),0));
  fVar96 = auVar13._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar4,auVar4,0x7f);
  fVar204 = auVar12._0_4_;
  auVar234 = ZEXT416((uint)fVar204);
  auVar13 = vrsqrtss_avx(auVar234,auVar234);
  fVar92 = auVar13._0_4_;
  auVar13 = vdpps_avx(auVar4,auVar5,0x7f);
  fVar92 = fVar92 * 1.5 + fVar204 * -0.5 * fVar92 * fVar92 * fVar92;
  fVar250 = fVar92 * auVar4._0_4_;
  fVar263 = fVar92 * auVar4._4_4_;
  fVar264 = fVar92 * auVar4._8_4_;
  fVar265 = fVar92 * auVar4._12_4_;
  auVar188._0_4_ = fVar204 * auVar5._0_4_;
  auVar188._4_4_ = fVar204 * auVar5._4_4_;
  auVar188._8_4_ = fVar204 * auVar5._8_4_;
  auVar188._12_4_ = fVar204 * auVar5._12_4_;
  fVar204 = auVar13._0_4_;
  auVar154._0_4_ = fVar204 * auVar4._0_4_;
  auVar154._4_4_ = fVar204 * auVar4._4_4_;
  auVar154._8_4_ = fVar204 * auVar4._8_4_;
  auVar154._12_4_ = fVar204 * auVar4._12_4_;
  auVar3 = vsubps_avx(auVar188,auVar154);
  auVar13 = vrcpss_avx(auVar234,auVar234);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar13,SUB6416(ZEXT464(0x40000000),0));
  fVar204 = auVar12._0_4_ * auVar13._0_4_;
  auVar12 = vshufps_avx(auVar6,auVar6,0xff);
  auVar218._0_4_ = auVar12._0_4_ * fVar166;
  auVar218._4_4_ = auVar12._4_4_ * fVar183;
  auVar218._8_4_ = auVar12._8_4_ * fVar184;
  auVar218._12_4_ = auVar12._12_4_ * fVar185;
  local_498 = vsubps_avx(auVar6,auVar218);
  auVar13 = vshufps_avx(auVar77,auVar77,0xff);
  auVar169._0_4_ = auVar13._0_4_ * fVar166 + fVar72 * auVar288._0_4_ * fVar96 * auVar12._0_4_;
  auVar169._4_4_ = auVar13._4_4_ * fVar183 + fVar72 * auVar288._4_4_ * fVar96 * auVar12._4_4_;
  auVar169._8_4_ = auVar13._8_4_ * fVar184 + fVar72 * auVar288._8_4_ * fVar96 * auVar12._8_4_;
  auVar169._12_4_ = auVar13._12_4_ * fVar185 + fVar72 * auVar288._12_4_ * fVar96 * auVar12._12_4_;
  auVar288 = vsubps_avx(auVar77,auVar169);
  local_4a8._0_4_ = auVar218._0_4_ + auVar6._0_4_;
  local_4a8._4_4_ = auVar218._4_4_ + auVar6._4_4_;
  fStack_4a0 = auVar218._8_4_ + auVar6._8_4_;
  fStack_49c = auVar218._12_4_ + auVar6._12_4_;
  auVar12 = vshufps_avx(auVar75,auVar75,0xff);
  auVar116._0_4_ = fVar250 * auVar12._0_4_;
  auVar116._4_4_ = fVar263 * auVar12._4_4_;
  auVar116._8_4_ = fVar264 * auVar12._8_4_;
  auVar116._12_4_ = fVar265 * auVar12._12_4_;
  local_4b8 = vsubps_avx(auVar75,auVar116);
  auVar13 = vshufps_avx(auVar186,auVar186,0xff);
  auVar98._0_4_ = fVar250 * auVar13._0_4_ + auVar12._0_4_ * fVar92 * auVar3._0_4_ * fVar204;
  auVar98._4_4_ = fVar263 * auVar13._4_4_ + auVar12._4_4_ * fVar92 * auVar3._4_4_ * fVar204;
  auVar98._8_4_ = fVar264 * auVar13._8_4_ + auVar12._8_4_ * fVar92 * auVar3._8_4_ * fVar204;
  auVar98._12_4_ = fVar265 * auVar13._12_4_ + auVar12._12_4_ * fVar92 * auVar3._12_4_ * fVar204;
  auVar12 = vsubps_avx(auVar186,auVar98);
  fVar166 = auVar75._0_4_ + auVar116._0_4_;
  fVar183 = auVar75._4_4_ + auVar116._4_4_;
  fVar184 = auVar75._8_4_ + auVar116._8_4_;
  fVar185 = auVar75._12_4_ + auVar116._12_4_;
  local_4c8._0_4_ = local_498._0_4_ + auVar288._0_4_ * 0.33333334;
  local_4c8._4_4_ = local_498._4_4_ + auVar288._4_4_ * 0.33333334;
  local_4c8._8_4_ = local_498._8_4_ + auVar288._8_4_ * 0.33333334;
  local_4c8._12_4_ = local_498._12_4_ + auVar288._12_4_ * 0.33333334;
  auVar99._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar99._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar99._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar99._12_4_ = auVar12._12_4_ * 0.33333334;
  local_4d8 = vsubps_avx(local_4b8,auVar99);
  local_478 = vsubps_avx(local_498,auVar254);
  auVar12 = vshufps_avx(local_478,local_478,0x55);
  auVar13 = vshufps_avx(local_478,local_478,0xaa);
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar72 = pre->ray_space[k].vz.field_0.m128[0];
  fVar92 = pre->ray_space[k].vz.field_0.m128[1];
  fVar96 = pre->ray_space[k].vz.field_0.m128[2];
  fVar204 = pre->ray_space[k].vz.field_0.m128[3];
  auVar100._0_4_ = fVar72 * auVar13._0_4_;
  auVar100._4_4_ = fVar92 * auVar13._4_4_;
  auVar100._8_4_ = fVar96 * auVar13._8_4_;
  auVar100._12_4_ = fVar204 * auVar13._12_4_;
  auVar288 = vfmadd231ps_fma(auVar100,(undefined1  [16])aVar2,auVar12);
  local_488 = vsubps_avx(local_4c8,auVar254);
  auVar12 = vshufps_avx(local_488,local_488,0x55);
  auVar13 = vshufps_avx(local_488,local_488,0xaa);
  auVar285._0_4_ = fVar72 * auVar13._0_4_;
  auVar285._4_4_ = fVar92 * auVar13._4_4_;
  auVar285._8_4_ = fVar96 * auVar13._8_4_;
  auVar285._12_4_ = fVar204 * auVar13._12_4_;
  auVar13 = vfmadd231ps_fma(auVar285,(undefined1  [16])aVar2,auVar12);
  local_2e8 = vsubps_avx(local_4d8,auVar254);
  auVar12 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar252._0_4_ = fVar72 * auVar12._0_4_;
  auVar252._4_4_ = fVar92 * auVar12._4_4_;
  auVar252._8_4_ = fVar96 * auVar12._8_4_;
  auVar252._12_4_ = fVar204 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar3 = vfmadd231ps_fma(auVar252,(undefined1  [16])aVar2,auVar12);
  local_2f8 = vsubps_avx(local_4b8,auVar254);
  auVar12 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar267._0_4_ = fVar72 * auVar12._0_4_;
  auVar267._4_4_ = fVar92 * auVar12._4_4_;
  auVar267._8_4_ = fVar96 * auVar12._8_4_;
  auVar267._12_4_ = fVar204 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar4 = vfmadd231ps_fma(auVar267,(undefined1  [16])aVar2,auVar12);
  local_308 = vsubps_avx(_local_4a8,auVar254);
  auVar12 = vshufps_avx(local_308,local_308,0xaa);
  auVar155._0_4_ = fVar72 * auVar12._0_4_;
  auVar155._4_4_ = fVar92 * auVar12._4_4_;
  auVar155._8_4_ = fVar96 * auVar12._8_4_;
  auVar155._12_4_ = fVar204 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_308,local_308,0x55);
  auVar5 = vfmadd231ps_fma(auVar155,(undefined1  [16])aVar2,auVar12);
  local_4e8._0_4_ = (fVar128 + auVar169._0_4_) * 0.33333334 + (float)local_4a8._0_4_;
  local_4e8._4_4_ = (fVar93 + auVar169._4_4_) * 0.33333334 + (float)local_4a8._4_4_;
  fStack_4e0 = (fVar94 + auVar169._8_4_) * 0.33333334 + fStack_4a0;
  fStack_4dc = (fVar152 + auVar169._12_4_) * 0.33333334 + fStack_49c;
  local_318 = vsubps_avx(_local_4e8,auVar254);
  auVar12 = vshufps_avx(local_318,local_318,0xaa);
  auVar207._0_4_ = auVar12._0_4_ * fVar72;
  auVar207._4_4_ = auVar12._4_4_ * fVar92;
  auVar207._8_4_ = auVar12._8_4_ * fVar96;
  auVar207._12_4_ = auVar12._12_4_ * fVar204;
  auVar12 = vshufps_avx(local_318,local_318,0x55);
  auVar234 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar2,auVar12);
  auVar219._0_4_ = (fVar74 + auVar98._0_4_) * 0.33333334;
  auVar219._4_4_ = (fVar232 + auVar98._4_4_) * 0.33333334;
  auVar219._8_4_ = (fVar141 + auVar98._8_4_) * 0.33333334;
  auVar219._12_4_ = (fVar151 + auVar98._12_4_) * 0.33333334;
  auVar135._4_4_ = fVar183;
  auVar135._0_4_ = fVar166;
  auVar135._8_4_ = fVar184;
  auVar135._12_4_ = fVar185;
  _local_4f8 = vsubps_avx(auVar135,auVar219);
  local_328 = vsubps_avx(_local_4f8,auVar254);
  auVar12 = vshufps_avx(local_328,local_328,0xaa);
  auVar220._0_4_ = auVar12._0_4_ * fVar72;
  auVar220._4_4_ = auVar12._4_4_ * fVar92;
  auVar220._8_4_ = auVar12._8_4_ * fVar96;
  auVar220._12_4_ = auVar12._12_4_ * fVar204;
  auVar12 = vshufps_avx(local_328,local_328,0x55);
  auVar6 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar2,auVar12);
  local_338 = vsubps_avx(auVar135,auVar254);
  auVar12 = vshufps_avx(local_338,local_338,0xaa);
  auVar76._0_4_ = fVar72 * auVar12._0_4_;
  auVar76._4_4_ = fVar92 * auVar12._4_4_;
  auVar76._8_4_ = fVar96 * auVar12._8_4_;
  auVar76._12_4_ = fVar204 * auVar12._12_4_;
  auVar12 = vshufps_avx(local_338,local_338,0x55);
  auVar12 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar2,auVar12);
  auVar170._4_4_ = local_478._0_4_;
  auVar170._0_4_ = local_478._0_4_;
  auVar170._8_4_ = local_478._0_4_;
  auVar170._12_4_ = local_478._0_4_;
  aVar2 = pre->ray_space[k].vx.field_0;
  auVar254 = vfmadd231ps_fma(auVar288,(undefined1  [16])aVar2,auVar170);
  auVar171._4_4_ = local_488._0_4_;
  auVar171._0_4_ = local_488._0_4_;
  auVar171._8_4_ = local_488._0_4_;
  auVar171._12_4_ = local_488._0_4_;
  auVar75 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar2,auVar171);
  uVar73 = local_2e8._0_4_;
  auVar172._4_4_ = uVar73;
  auVar172._0_4_ = uVar73;
  auVar172._8_4_ = uVar73;
  auVar172._12_4_ = uVar73;
  auVar3 = vfmadd231ps_fma(auVar3,(undefined1  [16])aVar2,auVar172);
  uVar73 = local_2f8._0_4_;
  auVar173._4_4_ = uVar73;
  auVar173._0_4_ = uVar73;
  auVar173._8_4_ = uVar73;
  auVar173._12_4_ = uVar73;
  auVar4 = vfmadd231ps_fma(auVar4,(undefined1  [16])aVar2,auVar173);
  uVar73 = local_308._0_4_;
  auVar174._4_4_ = uVar73;
  auVar174._0_4_ = uVar73;
  auVar174._8_4_ = uVar73;
  auVar174._12_4_ = uVar73;
  auVar5 = vfmadd231ps_fma(auVar5,(undefined1  [16])aVar2,auVar174);
  uVar73 = local_318._0_4_;
  auVar175._4_4_ = uVar73;
  auVar175._0_4_ = uVar73;
  auVar175._8_4_ = uVar73;
  auVar175._12_4_ = uVar73;
  auVar234 = vfmadd231ps_fma(auVar234,(undefined1  [16])aVar2,auVar175);
  uVar73 = local_328._0_4_;
  auVar176._4_4_ = uVar73;
  auVar176._0_4_ = uVar73;
  auVar176._8_4_ = uVar73;
  auVar176._12_4_ = uVar73;
  auVar6 = vfmadd231ps_fma(auVar6,(undefined1  [16])aVar2,auVar176);
  uVar73 = local_338._0_4_;
  auVar177._4_4_ = uVar73;
  auVar177._0_4_ = uVar73;
  auVar177._8_4_ = uVar73;
  auVar177._12_4_ = uVar73;
  auVar186 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar2,auVar177);
  local_3f8 = vmovlhps_avx(auVar254,auVar5);
  local_408 = vmovlhps_avx(auVar75,auVar234);
  local_418 = vmovlhps_avx(auVar3,auVar6);
  _local_468 = vmovlhps_avx(auVar4,auVar186);
  auVar12 = vminps_avx(local_3f8,local_408);
  auVar13 = vminps_avx(local_418,_local_468);
  auVar288 = vminps_avx(auVar12,auVar13);
  auVar12 = vmaxps_avx(local_3f8,local_408);
  auVar13 = vmaxps_avx(local_418,_local_468);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vshufpd_avx(auVar288,auVar288,3);
  auVar288 = vminps_avx(auVar288,auVar13);
  auVar13 = vshufpd_avx(auVar12,auVar12,3);
  auVar13 = vmaxps_avx(auVar12,auVar13);
  auVar287._8_4_ = 0x7fffffff;
  auVar287._0_8_ = 0x7fffffff7fffffff;
  auVar287._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar287,auVar288);
  auVar13 = vandps_avx(auVar287,auVar13);
  auVar12 = vmaxps_avx(auVar12,auVar13);
  auVar13 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar13,auVar12);
  fVar92 = auVar12._0_4_ * 9.536743e-07;
  auVar189._8_8_ = auVar254._0_8_;
  auVar189._0_8_ = auVar254._0_8_;
  auVar235._8_8_ = auVar75._0_8_;
  auVar235._0_8_ = auVar75._0_8_;
  auVar253._0_8_ = auVar3._0_8_;
  auVar253._8_8_ = auVar253._0_8_;
  auVar268._0_8_ = auVar4._0_8_;
  auVar268._8_8_ = auVar268._0_8_;
  fStack_260 = -fVar92;
  local_268 = -fVar92;
  fStack_264 = -fVar92;
  fStack_25c = fStack_260;
  fStack_258 = fStack_260;
  fStack_254 = fStack_260;
  fStack_250 = fStack_260;
  fStack_24c = fStack_260;
  local_358 = uVar60;
  uStack_354 = uVar60;
  uStack_350 = uVar60;
  uStack_34c = uVar60;
  uStack_364 = local_368;
  uStack_360 = local_368;
  uStack_35c = local_368;
  bVar69 = false;
  uVar62 = 0;
  fVar72 = *(float *)(ray + k * 4 + 0x30);
  local_2b8 = vsubps_avx(local_408,local_3f8);
  local_2c8 = vsubps_avx(local_418,local_408);
  local_2d8 = vsubps_avx(_local_468,local_418);
  local_378 = vsubps_avx(_local_4a8,local_498);
  local_388 = vsubps_avx(_local_4e8,local_4c8);
  local_398 = vsubps_avx(_local_4f8,local_4d8);
  auVar22._4_4_ = fVar183;
  auVar22._0_4_ = fVar166;
  auVar22._8_4_ = fVar184;
  auVar22._12_4_ = fVar185;
  _local_3a8 = vsubps_avx(auVar22,local_4b8);
  auVar77 = ZEXT816(0x3f80000000000000);
  local_248 = fVar92;
  fStack_244 = fVar92;
  fStack_240 = fVar92;
  fStack_23c = fVar92;
  fStack_238 = fVar92;
  fStack_234 = fVar92;
  fStack_230 = fVar92;
  fStack_22c = fVar92;
  local_348 = auVar77;
LAB_017fed8f:
  auVar12 = vshufps_avx(auVar77,auVar77,0x50);
  auVar286._8_4_ = 0x3f800000;
  auVar286._0_8_ = 0x3f8000003f800000;
  auVar286._12_4_ = 0x3f800000;
  auVar293._16_4_ = 0x3f800000;
  auVar293._0_16_ = auVar286;
  auVar293._20_4_ = 0x3f800000;
  auVar293._24_4_ = 0x3f800000;
  auVar293._28_4_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar286,auVar12);
  fVar96 = auVar12._0_4_;
  fVar141 = auVar5._0_4_;
  auVar78._0_4_ = fVar141 * fVar96;
  fVar204 = auVar12._4_4_;
  fVar151 = auVar5._4_4_;
  auVar78._4_4_ = fVar151 * fVar204;
  fVar128 = auVar12._8_4_;
  auVar78._8_4_ = fVar141 * fVar128;
  fVar93 = auVar12._12_4_;
  auVar78._12_4_ = fVar151 * fVar93;
  fVar250 = auVar234._0_4_;
  auVar178._0_4_ = fVar250 * fVar96;
  fVar263 = auVar234._4_4_;
  auVar178._4_4_ = fVar263 * fVar204;
  auVar178._8_4_ = fVar250 * fVar128;
  auVar178._12_4_ = fVar263 * fVar93;
  fVar203 = auVar6._0_4_;
  auVar143._0_4_ = fVar203 * fVar96;
  fVar215 = auVar6._4_4_;
  auVar143._4_4_ = fVar215 * fVar204;
  auVar143._8_4_ = fVar203 * fVar128;
  auVar143._12_4_ = fVar215 * fVar93;
  fVar216 = auVar186._0_4_;
  auVar117._0_4_ = fVar216 * fVar96;
  fVar231 = auVar186._4_4_;
  auVar117._4_4_ = fVar231 * fVar204;
  auVar117._8_4_ = fVar216 * fVar128;
  auVar117._12_4_ = fVar231 * fVar93;
  auVar4 = vfmadd231ps_fma(auVar78,auVar13,auVar189);
  auVar254 = vfmadd231ps_fma(auVar178,auVar13,auVar235);
  auVar75 = vfmadd231ps_fma(auVar143,auVar13,auVar253);
  auVar135 = vfmadd231ps_fma(auVar117,auVar268,auVar13);
  auVar12 = vmovshdup_avx(local_348);
  fVar96 = local_348._0_4_;
  fStack_e0 = (auVar12._0_4_ - fVar96) * 0.04761905;
  auVar229._4_4_ = fVar96;
  auVar229._0_4_ = fVar96;
  auVar229._8_4_ = fVar96;
  auVar229._12_4_ = fVar96;
  auVar229._16_4_ = fVar96;
  auVar229._20_4_ = fVar96;
  auVar229._24_4_ = fVar96;
  auVar229._28_4_ = fVar96;
  auVar111._0_8_ = auVar12._0_8_;
  auVar111._8_8_ = auVar111._0_8_;
  auVar111._16_8_ = auVar111._0_8_;
  auVar111._24_8_ = auVar111._0_8_;
  auVar88 = vsubps_avx(auVar111,auVar229);
  uVar73 = auVar4._0_4_;
  auVar282._4_4_ = uVar73;
  auVar282._0_4_ = uVar73;
  auVar282._8_4_ = uVar73;
  auVar282._12_4_ = uVar73;
  auVar282._16_4_ = uVar73;
  auVar282._20_4_ = uVar73;
  auVar282._24_4_ = uVar73;
  auVar282._28_4_ = uVar73;
  auVar12 = vmovshdup_avx(auVar4);
  uVar97 = auVar12._0_8_;
  auVar275._8_8_ = uVar97;
  auVar275._0_8_ = uVar97;
  auVar275._16_8_ = uVar97;
  auVar275._24_8_ = uVar97;
  fVar264 = auVar254._0_4_;
  auVar259._4_4_ = fVar264;
  auVar259._0_4_ = fVar264;
  auVar259._8_4_ = fVar264;
  auVar259._12_4_ = fVar264;
  auVar259._16_4_ = fVar264;
  auVar259._20_4_ = fVar264;
  auVar259._24_4_ = fVar264;
  auVar259._28_4_ = fVar264;
  auVar13 = vmovshdup_avx(auVar254);
  auVar112._0_8_ = auVar13._0_8_;
  auVar112._8_8_ = auVar112._0_8_;
  auVar112._16_8_ = auVar112._0_8_;
  auVar112._24_8_ = auVar112._0_8_;
  fVar232 = auVar75._0_4_;
  auVar195._4_4_ = fVar232;
  auVar195._0_4_ = fVar232;
  auVar195._8_4_ = fVar232;
  auVar195._12_4_ = fVar232;
  auVar195._16_4_ = fVar232;
  auVar195._20_4_ = fVar232;
  auVar195._24_4_ = fVar232;
  auVar195._28_4_ = fVar232;
  auVar288 = vmovshdup_avx(auVar75);
  auVar213._0_8_ = auVar288._0_8_;
  auVar213._8_8_ = auVar213._0_8_;
  auVar213._16_8_ = auVar213._0_8_;
  auVar213._24_8_ = auVar213._0_8_;
  fVar74 = auVar135._0_4_;
  auVar3 = vmovshdup_avx(auVar135);
  auVar245 = vfmadd132ps_fma(auVar88,auVar229,_DAT_01faff20);
  auVar88 = vsubps_avx(auVar293,ZEXT1632(auVar245));
  fVar96 = auVar245._0_4_;
  fVar204 = auVar245._4_4_;
  auVar14._4_4_ = fVar264 * fVar204;
  auVar14._0_4_ = fVar264 * fVar96;
  fVar128 = auVar245._8_4_;
  auVar14._8_4_ = fVar264 * fVar128;
  fVar93 = auVar245._12_4_;
  auVar14._12_4_ = fVar264 * fVar93;
  auVar14._16_4_ = fVar264 * 0.0;
  auVar14._20_4_ = fVar264 * 0.0;
  auVar14._24_4_ = fVar264 * 0.0;
  auVar14._28_4_ = 0x3f800000;
  auVar245 = vfmadd231ps_fma(auVar14,auVar88,auVar282);
  fVar94 = auVar13._0_4_;
  fVar152 = auVar13._4_4_;
  auVar25._4_4_ = fVar152 * fVar204;
  auVar25._0_4_ = fVar94 * fVar96;
  auVar25._8_4_ = fVar94 * fVar128;
  auVar25._12_4_ = fVar152 * fVar93;
  auVar25._16_4_ = fVar94 * 0.0;
  auVar25._20_4_ = fVar152 * 0.0;
  auVar25._24_4_ = fVar94 * 0.0;
  auVar25._28_4_ = uVar73;
  auVar22 = vfmadd231ps_fma(auVar25,auVar88,auVar275);
  auVar26._4_4_ = fVar232 * fVar204;
  auVar26._0_4_ = fVar232 * fVar96;
  auVar26._8_4_ = fVar232 * fVar128;
  auVar26._12_4_ = fVar232 * fVar93;
  auVar26._16_4_ = fVar232 * 0.0;
  auVar26._20_4_ = fVar232 * 0.0;
  auVar26._24_4_ = fVar232 * 0.0;
  auVar26._28_4_ = auVar12._4_4_;
  auVar287 = vfmadd231ps_fma(auVar26,auVar88,auVar259);
  fVar94 = auVar288._0_4_;
  fVar152 = auVar288._4_4_;
  auVar27._4_4_ = fVar152 * fVar204;
  auVar27._0_4_ = fVar94 * fVar96;
  auVar27._8_4_ = fVar94 * fVar128;
  auVar27._12_4_ = fVar152 * fVar93;
  auVar27._16_4_ = fVar94 * 0.0;
  auVar27._20_4_ = fVar152 * 0.0;
  auVar27._24_4_ = fVar94 * 0.0;
  auVar27._28_4_ = fVar264;
  auVar132 = vfmadd231ps_fma(auVar27,auVar88,auVar112);
  auVar12 = vshufps_avx(auVar4,auVar4,0xaa);
  local_548._8_8_ = auVar12._0_8_;
  local_548._0_8_ = local_548._8_8_;
  local_548._16_8_ = local_548._8_8_;
  local_548._24_8_ = local_548._8_8_;
  auVar13 = vshufps_avx(auVar4,auVar4,0xff);
  uStack_640 = auVar13._0_8_;
  local_648 = (undefined1  [8])uStack_640;
  uStack_638 = uStack_640;
  uStack_630 = uStack_640;
  auVar28._4_4_ = fVar74 * fVar204;
  auVar28._0_4_ = fVar74 * fVar96;
  auVar28._8_4_ = fVar74 * fVar128;
  auVar28._12_4_ = fVar74 * fVar93;
  auVar28._16_4_ = fVar74 * 0.0;
  auVar28._20_4_ = fVar74 * 0.0;
  auVar28._24_4_ = fVar74 * 0.0;
  auVar28._28_4_ = fVar74;
  auVar4 = vfmadd231ps_fma(auVar28,auVar88,auVar195);
  auVar13 = vshufps_avx(auVar254,auVar254,0xaa);
  auVar196._0_8_ = auVar13._0_8_;
  auVar196._8_8_ = auVar196._0_8_;
  auVar196._16_8_ = auVar196._0_8_;
  auVar196._24_8_ = auVar196._0_8_;
  auVar288 = vshufps_avx(auVar254,auVar254,0xff);
  local_608._8_8_ = auVar288._0_8_;
  local_608._0_8_ = local_608._8_8_;
  local_608._16_8_ = local_608._8_8_;
  local_608._24_8_ = local_608._8_8_;
  fVar94 = auVar3._0_4_;
  fVar152 = auVar3._4_4_;
  auVar29._4_4_ = fVar152 * fVar204;
  auVar29._0_4_ = fVar94 * fVar96;
  auVar29._8_4_ = fVar94 * fVar128;
  auVar29._12_4_ = fVar152 * fVar93;
  auVar29._16_4_ = fVar94 * 0.0;
  auVar29._20_4_ = fVar152 * 0.0;
  auVar29._24_4_ = fVar94 * 0.0;
  auVar29._28_4_ = auVar12._4_4_;
  auVar76 = vfmadd231ps_fma(auVar29,auVar88,auVar213);
  auVar30._28_4_ = fVar152;
  auVar30._0_28_ =
       ZEXT1628(CONCAT412(auVar287._12_4_ * fVar93,
                          CONCAT48(auVar287._8_4_ * fVar128,
                                   CONCAT44(auVar287._4_4_ * fVar204,auVar287._0_4_ * fVar96))));
  auVar245 = vfmadd231ps_fma(auVar30,auVar88,ZEXT1632(auVar245));
  fVar94 = auVar288._4_4_;
  auVar31._28_4_ = fVar94;
  auVar31._0_28_ =
       ZEXT1628(CONCAT412(auVar132._12_4_ * fVar93,
                          CONCAT48(auVar132._8_4_ * fVar128,
                                   CONCAT44(auVar132._4_4_ * fVar204,auVar132._0_4_ * fVar96))));
  auVar22 = vfmadd231ps_fma(auVar31,auVar88,ZEXT1632(auVar22));
  auVar12 = vshufps_avx(auVar75,auVar75,0xaa);
  uVar97 = auVar12._0_8_;
  auVar182._8_8_ = uVar97;
  auVar182._0_8_ = uVar97;
  auVar182._16_8_ = uVar97;
  auVar182._24_8_ = uVar97;
  auVar3 = vshufps_avx(auVar75,auVar75,0xff);
  uVar97 = auVar3._0_8_;
  auVar294._8_8_ = uVar97;
  auVar294._0_8_ = uVar97;
  auVar294._16_8_ = uVar97;
  auVar294._24_8_ = uVar97;
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar93,
                                               CONCAT48(auVar4._8_4_ * fVar128,
                                                        CONCAT44(auVar4._4_4_ * fVar204,
                                                                 auVar4._0_4_ * fVar96)))),auVar88,
                            ZEXT1632(auVar287));
  auVar4 = vshufps_avx(auVar135,auVar135,0xaa);
  auVar254 = vshufps_avx(auVar135,auVar135,0xff);
  auVar135 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar76._12_4_,
                                                CONCAT48(fVar128 * auVar76._8_4_,
                                                         CONCAT44(fVar204 * auVar76._4_4_,
                                                                  fVar96 * auVar76._0_4_)))),auVar88
                             ,ZEXT1632(auVar132));
  auVar287 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar75._12_4_,
                                                CONCAT48(fVar128 * auVar75._8_4_,
                                                         CONCAT44(fVar204 * auVar75._4_4_,
                                                                  fVar96 * auVar75._0_4_)))),auVar88
                             ,ZEXT1632(auVar245));
  auVar14 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar245));
  auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar135._12_4_,
                                               CONCAT48(fVar128 * auVar135._8_4_,
                                                        CONCAT44(fVar204 * auVar135._4_4_,
                                                                 fVar96 * auVar135._0_4_)))),auVar88
                            ,ZEXT1632(auVar22));
  auVar15 = vsubps_avx(ZEXT1632(auVar135),ZEXT1632(auVar22));
  fStack_43c = auVar15._28_4_;
  auVar260._0_4_ = fStack_e0 * auVar14._0_4_ * 3.0;
  auVar260._4_4_ = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar260._8_4_ = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar260._12_4_ = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar260._16_4_ = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar260._20_4_ = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar260._24_4_ = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar260._28_4_ = 0;
  local_458._0_4_ = fStack_e0 * auVar15._0_4_ * 3.0;
  local_458._4_4_ = fStack_e0 * auVar15._4_4_ * 3.0;
  fStack_450 = fStack_e0 * auVar15._8_4_ * 3.0;
  fStack_44c = fStack_e0 * auVar15._12_4_ * 3.0;
  fStack_448 = fStack_e0 * auVar15._16_4_ * 3.0;
  fStack_444 = fStack_e0 * auVar15._20_4_ * 3.0;
  fStack_440 = fStack_e0 * auVar15._24_4_ * 3.0;
  fVar152 = auVar13._0_4_;
  fVar74 = auVar13._4_4_;
  auVar32._4_4_ = fVar74 * fVar204;
  auVar32._0_4_ = fVar152 * fVar96;
  auVar32._8_4_ = fVar152 * fVar128;
  auVar32._12_4_ = fVar74 * fVar93;
  auVar32._16_4_ = fVar152 * 0.0;
  auVar32._20_4_ = fVar74 * 0.0;
  auVar32._24_4_ = fVar152 * 0.0;
  auVar32._28_4_ = fStack_43c;
  auVar13 = vfmadd231ps_fma(auVar32,auVar88,local_548);
  fVar152 = auVar288._0_4_;
  auVar33._4_4_ = fVar94 * fVar204;
  auVar33._0_4_ = fVar152 * fVar96;
  auVar33._8_4_ = fVar152 * fVar128;
  auVar33._12_4_ = fVar94 * fVar93;
  auVar33._16_4_ = fVar152 * 0.0;
  auVar33._20_4_ = fVar94 * 0.0;
  auVar33._24_4_ = fVar152 * 0.0;
  auVar33._28_4_ = 0;
  auVar288 = vfmadd231ps_fma(auVar33,auVar88,_local_648);
  fVar94 = auVar12._0_4_;
  fVar152 = auVar12._4_4_;
  auVar34._4_4_ = fVar152 * fVar204;
  auVar34._0_4_ = fVar94 * fVar96;
  auVar34._8_4_ = fVar94 * fVar128;
  auVar34._12_4_ = fVar152 * fVar93;
  auVar34._16_4_ = fVar94 * 0.0;
  auVar34._20_4_ = fVar152 * 0.0;
  auVar34._24_4_ = fVar94 * 0.0;
  auVar34._28_4_ = auVar14._28_4_;
  auVar12 = vfmadd231ps_fma(auVar34,auVar88,auVar196);
  fVar94 = auVar3._0_4_;
  fVar232 = auVar3._4_4_;
  auVar35._4_4_ = fVar232 * fVar204;
  auVar35._0_4_ = fVar94 * fVar96;
  auVar35._8_4_ = fVar94 * fVar128;
  auVar35._12_4_ = fVar232 * fVar93;
  auVar35._16_4_ = fVar94 * 0.0;
  auVar35._20_4_ = fVar232 * 0.0;
  auVar35._24_4_ = fVar94 * 0.0;
  auVar35._28_4_ = fVar74;
  auVar3 = vfmadd231ps_fma(auVar35,auVar88,local_608);
  auVar18 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar287));
  fVar94 = auVar4._0_4_;
  fVar152 = auVar4._4_4_;
  auVar36._4_4_ = fVar152 * fVar204;
  auVar36._0_4_ = fVar94 * fVar96;
  auVar36._8_4_ = fVar94 * fVar128;
  auVar36._12_4_ = fVar152 * fVar93;
  auVar36._16_4_ = fVar94 * 0.0;
  auVar36._20_4_ = fVar152 * 0.0;
  auVar36._24_4_ = fVar94 * 0.0;
  auVar36._28_4_ = fVar152;
  auVar4 = vfmadd231ps_fma(auVar36,auVar88,auVar182);
  auVar19 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar75));
  fVar94 = auVar254._0_4_;
  fVar152 = auVar254._4_4_;
  auVar37._4_4_ = fVar152 * fVar204;
  auVar37._0_4_ = fVar94 * fVar96;
  auVar37._8_4_ = fVar94 * fVar128;
  auVar37._12_4_ = fVar152 * fVar93;
  auVar37._16_4_ = fVar94 * 0.0;
  auVar37._20_4_ = fVar152 * 0.0;
  auVar37._24_4_ = fVar94 * 0.0;
  auVar37._28_4_ = fVar152;
  auVar254 = vfmadd231ps_fma(auVar37,auVar88,auVar294);
  auVar38._28_4_ = fVar232;
  auVar38._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar93,
                          CONCAT48(auVar12._8_4_ * fVar128,
                                   CONCAT44(auVar12._4_4_ * fVar204,auVar12._0_4_ * fVar96))));
  auVar13 = vfmadd231ps_fma(auVar38,auVar88,ZEXT1632(auVar13));
  auVar288 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar3._12_4_,
                                                CONCAT48(fVar128 * auVar3._8_4_,
                                                         CONCAT44(fVar204 * auVar3._4_4_,
                                                                  fVar96 * auVar3._0_4_)))),auVar88,
                             ZEXT1632(auVar288));
  auVar113._0_4_ = auVar287._0_4_ + auVar260._0_4_;
  auVar113._4_4_ = auVar287._4_4_ + auVar260._4_4_;
  auVar113._8_4_ = auVar287._8_4_ + auVar260._8_4_;
  auVar113._12_4_ = auVar287._12_4_ + auVar260._12_4_;
  auVar113._16_4_ = auVar260._16_4_ + 0.0;
  auVar113._20_4_ = auVar260._20_4_ + 0.0;
  auVar113._24_4_ = auVar260._24_4_ + 0.0;
  auVar113._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar4._12_4_ * fVar93,
                                               CONCAT48(auVar4._8_4_ * fVar128,
                                                        CONCAT44(auVar4._4_4_ * fVar204,
                                                                 auVar4._0_4_ * fVar96)))),auVar88,
                            ZEXT1632(auVar12));
  auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar254._12_4_ * fVar93,
                                              CONCAT48(auVar254._8_4_ * fVar128,
                                                       CONCAT44(auVar254._4_4_ * fVar204,
                                                                auVar254._0_4_ * fVar96)))),auVar88,
                           ZEXT1632(auVar3));
  auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar93 * auVar12._12_4_,
                                              CONCAT48(fVar128 * auVar12._8_4_,
                                                       CONCAT44(fVar204 * auVar12._4_4_,
                                                                fVar96 * auVar12._0_4_)))),auVar88,
                           ZEXT1632(auVar13));
  auVar254 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * fVar93,
                                                CONCAT48(auVar3._8_4_ * fVar128,
                                                         CONCAT44(auVar3._4_4_ * fVar204,
                                                                  auVar3._0_4_ * fVar96)))),
                             ZEXT1632(auVar288),auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar14 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar288));
  auVar283._0_4_ = fStack_e0 * auVar88._0_4_ * 3.0;
  auVar283._4_4_ = fStack_e0 * auVar88._4_4_ * 3.0;
  auVar283._8_4_ = fStack_e0 * auVar88._8_4_ * 3.0;
  auVar283._12_4_ = fStack_e0 * auVar88._12_4_ * 3.0;
  auVar283._16_4_ = fStack_e0 * auVar88._16_4_ * 3.0;
  auVar283._20_4_ = fStack_e0 * auVar88._20_4_ * 3.0;
  auVar283._24_4_ = fStack_e0 * auVar88._24_4_ * 3.0;
  auVar283._28_4_ = 0;
  local_f8 = fStack_e0 * auVar14._0_4_ * 3.0;
  fStack_f4 = fStack_e0 * auVar14._4_4_ * 3.0;
  auVar39._4_4_ = fStack_f4;
  auVar39._0_4_ = local_f8;
  fStack_f0 = fStack_e0 * auVar14._8_4_ * 3.0;
  auVar39._8_4_ = fStack_f0;
  fStack_ec = fStack_e0 * auVar14._12_4_ * 3.0;
  auVar39._12_4_ = fStack_ec;
  fStack_e8 = fStack_e0 * auVar14._16_4_ * 3.0;
  auVar39._16_4_ = fStack_e8;
  fStack_e4 = fStack_e0 * auVar14._20_4_ * 3.0;
  auVar39._20_4_ = fStack_e4;
  fStack_e0 = fStack_e0 * auVar14._24_4_ * 3.0;
  auVar39._24_4_ = fStack_e0;
  auVar39._28_4_ = 0x40400000;
  _local_438 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar4));
  local_288 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar254));
  auVar88 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar287));
  auVar14 = vsubps_avx(ZEXT1632(auVar254),ZEXT1632(auVar75));
  auVar15 = vsubps_avx(_local_438,auVar18);
  fVar264 = auVar88._0_4_ + auVar15._0_4_;
  fVar265 = auVar88._4_4_ + auVar15._4_4_;
  fVar198 = auVar88._8_4_ + auVar15._8_4_;
  fVar199 = auVar88._12_4_ + auVar15._12_4_;
  fVar200 = auVar88._16_4_ + auVar15._16_4_;
  fVar201 = auVar88._20_4_ + auVar15._20_4_;
  fVar202 = auVar88._24_4_ + auVar15._24_4_;
  auVar16 = vsubps_avx(local_288,auVar19);
  auVar89._0_4_ = auVar14._0_4_ + auVar16._0_4_;
  auVar89._4_4_ = auVar14._4_4_ + auVar16._4_4_;
  auVar89._8_4_ = auVar14._8_4_ + auVar16._8_4_;
  auVar89._12_4_ = auVar14._12_4_ + auVar16._12_4_;
  auVar89._16_4_ = auVar14._16_4_ + auVar16._16_4_;
  auVar89._20_4_ = auVar14._20_4_ + auVar16._20_4_;
  auVar89._24_4_ = auVar14._24_4_ + auVar16._24_4_;
  auVar89._28_4_ = auVar14._28_4_ + auVar16._28_4_;
  local_98 = ZEXT1632(auVar75);
  fVar96 = auVar75._0_4_;
  local_118 = (float)local_458._0_4_ + fVar96;
  fVar204 = auVar75._4_4_;
  fStack_114 = (float)local_458._4_4_ + fVar204;
  fVar128 = auVar75._8_4_;
  fStack_110 = fStack_450 + fVar128;
  fVar93 = auVar75._12_4_;
  fStack_10c = fStack_44c + fVar93;
  fStack_108 = fStack_448 + 0.0;
  fStack_104 = fStack_444 + 0.0;
  fStack_100 = fStack_440 + 0.0;
  local_2a8 = ZEXT1632(auVar287);
  auVar14 = vsubps_avx(local_2a8,auVar260);
  local_78 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar14 = vsubps_avx(local_98,_local_458);
  local_138 = vpermps_avx2(_DAT_01fec480,auVar14);
  local_b8._0_4_ = auVar4._0_4_ + auVar283._0_4_;
  local_b8._4_4_ = auVar4._4_4_ + auVar283._4_4_;
  local_b8._8_4_ = auVar4._8_4_ + auVar283._8_4_;
  local_b8._12_4_ = auVar4._12_4_ + auVar283._12_4_;
  local_b8._16_4_ = auVar283._16_4_ + 0.0;
  local_b8._20_4_ = auVar283._20_4_ + 0.0;
  local_b8._24_4_ = auVar283._24_4_ + 0.0;
  local_b8._28_4_ = 0;
  auVar230 = ZEXT3264(local_b8);
  auVar261 = ZEXT1632(auVar4);
  auVar14 = vsubps_avx(auVar261,auVar283);
  auVar20 = vpermps_avx2(_DAT_01fec480,auVar14);
  fVar94 = auVar254._0_4_;
  local_f8 = fVar94 + local_f8;
  fVar152 = auVar254._4_4_;
  fStack_f4 = fVar152 + fStack_f4;
  fVar74 = auVar254._8_4_;
  fStack_f0 = fVar74 + fStack_f0;
  fVar232 = auVar254._12_4_;
  fStack_ec = fVar232 + fStack_ec;
  fStack_e8 = fStack_e8 + 0.0;
  fStack_e4 = fStack_e4 + 0.0;
  fStack_e0 = fStack_e0 + 0.0;
  auVar14 = vsubps_avx(ZEXT1632(auVar254),auVar39);
  local_d8 = vpermps_avx2(_DAT_01fec480,auVar14);
  auVar40._4_4_ = fVar204 * fVar265;
  auVar40._0_4_ = fVar96 * fVar264;
  auVar40._8_4_ = fVar128 * fVar198;
  auVar40._12_4_ = fVar93 * fVar199;
  auVar40._16_4_ = fVar200 * 0.0;
  auVar40._20_4_ = fVar201 * 0.0;
  auVar40._24_4_ = fVar202 * 0.0;
  auVar40._28_4_ = auVar14._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar40,local_2a8,auVar89);
  fStack_fc = fStack_43c + 0.0;
  auVar41._4_4_ = fStack_114 * fVar265;
  auVar41._0_4_ = local_118 * fVar264;
  auVar41._8_4_ = fStack_110 * fVar198;
  auVar41._12_4_ = fStack_10c * fVar199;
  auVar41._16_4_ = fStack_108 * fVar200;
  auVar41._20_4_ = fStack_104 * fVar201;
  auVar41._24_4_ = fStack_100 * fVar202;
  auVar41._28_4_ = 0;
  auVar13 = vfnmadd231ps_fma(auVar41,auVar89,auVar113);
  auVar42._4_4_ = local_138._4_4_ * fVar265;
  auVar42._0_4_ = local_138._0_4_ * fVar264;
  auVar42._8_4_ = local_138._8_4_ * fVar198;
  auVar42._12_4_ = local_138._12_4_ * fVar199;
  auVar42._16_4_ = local_138._16_4_ * fVar200;
  auVar42._20_4_ = local_138._20_4_ * fVar201;
  auVar42._24_4_ = local_138._24_4_ * fVar202;
  auVar42._28_4_ = fStack_43c + 0.0;
  auVar288 = vfnmadd231ps_fma(auVar42,local_78,auVar89);
  local_648._0_4_ = auVar19._0_4_;
  local_648._4_4_ = auVar19._4_4_;
  uStack_640._0_4_ = auVar19._8_4_;
  uStack_640._4_4_ = auVar19._12_4_;
  uStack_638._0_4_ = auVar19._16_4_;
  uStack_638._4_4_ = auVar19._20_4_;
  uStack_630._0_4_ = auVar19._24_4_;
  uStack_630._4_4_ = auVar19._28_4_;
  auVar43._4_4_ = (float)local_648._4_4_ * fVar265;
  auVar43._0_4_ = (float)local_648._0_4_ * fVar264;
  auVar43._8_4_ = (float)uStack_640 * fVar198;
  auVar43._12_4_ = uStack_640._4_4_ * fVar199;
  auVar43._16_4_ = (float)uStack_638 * fVar200;
  auVar43._20_4_ = uStack_638._4_4_ * fVar201;
  auVar43._24_4_ = (float)uStack_630 * fVar202;
  auVar43._28_4_ = uStack_630._4_4_;
  auVar3 = vfnmadd231ps_fma(auVar43,auVar18,auVar89);
  auVar214._0_4_ = fVar94 * fVar264;
  auVar214._4_4_ = fVar152 * fVar265;
  auVar214._8_4_ = fVar74 * fVar198;
  auVar214._12_4_ = fVar232 * fVar199;
  auVar214._16_4_ = fVar200 * 0.0;
  auVar214._20_4_ = fVar201 * 0.0;
  auVar214._24_4_ = fVar202 * 0.0;
  auVar214._28_4_ = 0;
  auVar4 = vfnmadd231ps_fma(auVar214,auVar261,auVar89);
  uStack_dc = 0x40400000;
  auVar44._4_4_ = fStack_f4 * fVar265;
  auVar44._0_4_ = local_f8 * fVar264;
  auVar44._8_4_ = fStack_f0 * fVar198;
  auVar44._12_4_ = fStack_ec * fVar199;
  auVar44._16_4_ = fStack_e8 * fVar200;
  auVar44._20_4_ = fStack_e4 * fVar201;
  auVar44._24_4_ = fStack_e0 * fVar202;
  auVar44._28_4_ = auVar18._28_4_;
  auVar75 = vfnmadd231ps_fma(auVar44,local_b8,auVar89);
  auVar45._4_4_ = local_d8._4_4_ * fVar265;
  auVar45._0_4_ = local_d8._0_4_ * fVar264;
  auVar45._8_4_ = local_d8._8_4_ * fVar198;
  auVar45._12_4_ = local_d8._12_4_ * fVar199;
  auVar45._16_4_ = local_d8._16_4_ * fVar200;
  auVar45._20_4_ = local_d8._20_4_ * fVar201;
  auVar45._24_4_ = local_d8._24_4_ * fVar202;
  auVar45._28_4_ = local_d8._28_4_;
  auVar135 = vfnmadd231ps_fma(auVar45,auVar20,auVar89);
  auVar46._4_4_ = local_288._4_4_ * fVar265;
  auVar46._0_4_ = local_288._0_4_ * fVar264;
  auVar46._8_4_ = local_288._8_4_ * fVar198;
  auVar46._12_4_ = local_288._12_4_ * fVar199;
  auVar46._16_4_ = local_288._16_4_ * fVar200;
  auVar46._20_4_ = local_288._20_4_ * fVar201;
  auVar46._24_4_ = local_288._24_4_ * fVar202;
  auVar46._28_4_ = auVar88._28_4_ + auVar15._28_4_;
  auVar245 = vfnmadd231ps_fma(auVar46,_local_438,auVar89);
  auVar14 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar88 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar13));
  auVar15 = vminps_avx(ZEXT1632(auVar288),ZEXT1632(auVar3));
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar288),ZEXT1632(auVar3));
  auVar88 = vmaxps_avx(auVar88,auVar14);
  auVar16 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar75));
  auVar14 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar75));
  auVar17 = vminps_avx(ZEXT1632(auVar135),ZEXT1632(auVar245));
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar16 = vminps_avx(auVar15,auVar16);
  auVar15 = vmaxps_avx(ZEXT1632(auVar135),ZEXT1632(auVar245));
  auVar14 = vmaxps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(auVar88,auVar14);
  auVar57._4_4_ = fStack_244;
  auVar57._0_4_ = local_248;
  auVar57._8_4_ = fStack_240;
  auVar57._12_4_ = fStack_23c;
  auVar57._16_4_ = fStack_238;
  auVar57._20_4_ = fStack_234;
  auVar57._24_4_ = fStack_230;
  auVar57._28_4_ = fStack_22c;
  auVar88 = vcmpps_avx(auVar16,auVar57,2);
  auVar55._4_4_ = fStack_264;
  auVar55._0_4_ = local_268;
  auVar55._8_4_ = fStack_260;
  auVar55._12_4_ = fStack_25c;
  auVar55._16_4_ = fStack_258;
  auVar55._20_4_ = fStack_254;
  auVar55._24_4_ = fStack_250;
  auVar55._28_4_ = fStack_24c;
  auVar14 = vcmpps_avx(auVar14,auVar55,5);
  auVar88 = vandps_avx(auVar14,auVar88);
  auVar14 = local_158 & auVar88;
  _local_458 = auVar20;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vsubps_avx(auVar18,local_2a8);
    auVar15 = vsubps_avx(_local_438,auVar261);
    fVar265 = auVar14._0_4_ + auVar15._0_4_;
    fVar198 = auVar14._4_4_ + auVar15._4_4_;
    fVar199 = auVar14._8_4_ + auVar15._8_4_;
    fVar200 = auVar14._12_4_ + auVar15._12_4_;
    fVar201 = auVar14._16_4_ + auVar15._16_4_;
    fVar202 = auVar14._20_4_ + auVar15._20_4_;
    fVar95 = auVar14._24_4_ + auVar15._24_4_;
    auVar16 = vsubps_avx(auVar19,local_98);
    auVar17 = vsubps_avx(local_288,ZEXT1632(auVar254));
    auVar114._0_4_ = auVar16._0_4_ + auVar17._0_4_;
    auVar114._4_4_ = auVar16._4_4_ + auVar17._4_4_;
    auVar114._8_4_ = auVar16._8_4_ + auVar17._8_4_;
    auVar114._12_4_ = auVar16._12_4_ + auVar17._12_4_;
    auVar114._16_4_ = auVar16._16_4_ + auVar17._16_4_;
    auVar114._20_4_ = auVar16._20_4_ + auVar17._20_4_;
    auVar114._24_4_ = auVar16._24_4_ + auVar17._24_4_;
    fVar264 = auVar17._28_4_;
    auVar114._28_4_ = auVar16._28_4_ + fVar264;
    auVar47._4_4_ = fVar204 * fVar198;
    auVar47._0_4_ = fVar96 * fVar265;
    auVar47._8_4_ = fVar128 * fVar199;
    auVar47._12_4_ = fVar93 * fVar200;
    auVar47._16_4_ = fVar201 * 0.0;
    auVar47._20_4_ = fVar202 * 0.0;
    auVar47._24_4_ = fVar95 * 0.0;
    auVar47._28_4_ = local_438._28_4_;
    auVar4 = vfnmadd231ps_fma(auVar47,auVar114,local_2a8);
    auVar48._4_4_ = fVar198 * fStack_114;
    auVar48._0_4_ = fVar265 * local_118;
    auVar48._8_4_ = fVar199 * fStack_110;
    auVar48._12_4_ = fVar200 * fStack_10c;
    auVar48._16_4_ = fVar201 * fStack_108;
    auVar48._20_4_ = fVar202 * fStack_104;
    auVar48._24_4_ = fVar95 * fStack_100;
    auVar48._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(auVar113,auVar114,auVar48);
    auVar49._4_4_ = fVar198 * local_138._4_4_;
    auVar49._0_4_ = fVar265 * local_138._0_4_;
    auVar49._8_4_ = fVar199 * local_138._8_4_;
    auVar49._12_4_ = fVar200 * local_138._12_4_;
    auVar49._16_4_ = fVar201 * local_138._16_4_;
    auVar49._20_4_ = fVar202 * local_138._20_4_;
    auVar49._24_4_ = fVar95 * local_138._24_4_;
    auVar49._28_4_ = 0;
    auVar13 = vfnmadd213ps_fma(local_78,auVar114,auVar49);
    auVar50._4_4_ = (float)local_648._4_4_ * fVar198;
    auVar50._0_4_ = (float)local_648._0_4_ * fVar265;
    auVar50._8_4_ = (float)uStack_640 * fVar199;
    auVar50._12_4_ = uStack_640._4_4_ * fVar200;
    auVar50._16_4_ = (float)uStack_638 * fVar201;
    auVar50._20_4_ = uStack_638._4_4_ * fVar202;
    auVar50._24_4_ = (float)uStack_630 * fVar95;
    auVar50._28_4_ = 0;
    auVar254 = vfnmadd231ps_fma(auVar50,auVar114,auVar18);
    auVar139._0_4_ = fVar94 * fVar265;
    auVar139._4_4_ = fVar152 * fVar198;
    auVar139._8_4_ = fVar74 * fVar199;
    auVar139._12_4_ = fVar232 * fVar200;
    auVar139._16_4_ = fVar201 * 0.0;
    auVar139._20_4_ = fVar202 * 0.0;
    auVar139._24_4_ = fVar95 * 0.0;
    auVar139._28_4_ = 0;
    auVar75 = vfnmadd231ps_fma(auVar139,auVar114,auVar261);
    auVar51._4_4_ = fVar198 * fStack_f4;
    auVar51._0_4_ = fVar265 * local_f8;
    auVar51._8_4_ = fVar199 * fStack_f0;
    auVar51._12_4_ = fVar200 * fStack_ec;
    auVar51._16_4_ = fVar201 * fStack_e8;
    auVar51._20_4_ = fVar202 * fStack_e4;
    auVar51._24_4_ = fVar95 * fStack_e0;
    auVar51._28_4_ = fVar264;
    auVar288 = vfnmadd213ps_fma(local_b8,auVar114,auVar51);
    auVar52._4_4_ = fVar198 * local_d8._4_4_;
    auVar52._0_4_ = fVar265 * local_d8._0_4_;
    auVar52._8_4_ = fVar199 * local_d8._8_4_;
    auVar52._12_4_ = fVar200 * local_d8._12_4_;
    auVar52._16_4_ = fVar201 * local_d8._16_4_;
    auVar52._20_4_ = fVar202 * local_d8._20_4_;
    auVar52._24_4_ = fVar95 * local_d8._24_4_;
    auVar52._28_4_ = fVar264;
    auVar3 = vfnmadd213ps_fma(auVar20,auVar114,auVar52);
    auVar230 = ZEXT1664(auVar3);
    auVar53._4_4_ = local_288._4_4_ * fVar198;
    auVar53._0_4_ = local_288._0_4_ * fVar265;
    auVar53._8_4_ = local_288._8_4_ * fVar199;
    auVar53._12_4_ = local_288._12_4_ * fVar200;
    auVar53._16_4_ = local_288._16_4_ * fVar201;
    auVar53._20_4_ = local_288._20_4_ * fVar202;
    auVar53._24_4_ = local_288._24_4_ * fVar95;
    auVar53._28_4_ = auVar14._28_4_ + auVar15._28_4_;
    auVar135 = vfnmadd231ps_fma(auVar53,_local_438,auVar114);
    auVar15 = vminps_avx(ZEXT1632(auVar4),ZEXT1632(auVar12));
    auVar14 = vmaxps_avx(ZEXT1632(auVar4),ZEXT1632(auVar12));
    auVar16 = vminps_avx(ZEXT1632(auVar13),ZEXT1632(auVar254));
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar254));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar17 = vminps_avx(ZEXT1632(auVar75),ZEXT1632(auVar288));
    auVar15 = vmaxps_avx(ZEXT1632(auVar75),ZEXT1632(auVar288));
    auVar18 = vminps_avx(ZEXT1632(auVar3),ZEXT1632(auVar135));
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(ZEXT1632(auVar3),ZEXT1632(auVar135));
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar14,auVar15);
    auVar58._4_4_ = fStack_244;
    auVar58._0_4_ = local_248;
    auVar58._8_4_ = fStack_240;
    auVar58._12_4_ = fStack_23c;
    auVar58._16_4_ = fStack_238;
    auVar58._20_4_ = fStack_234;
    auVar58._24_4_ = fStack_230;
    auVar58._28_4_ = fStack_22c;
    auVar14 = vcmpps_avx(auVar17,auVar58,2);
    auVar56._4_4_ = fStack_264;
    auVar56._0_4_ = local_268;
    auVar56._8_4_ = fStack_260;
    auVar56._12_4_ = fStack_25c;
    auVar56._16_4_ = fStack_258;
    auVar56._20_4_ = fStack_254;
    auVar56._24_4_ = fStack_250;
    auVar56._28_4_ = fStack_24c;
    auVar15 = vcmpps_avx(auVar15,auVar56,5);
    auVar14 = vandps_avx(auVar15,auVar14);
    auVar88 = vandps_avx(local_158,auVar88);
    auVar15 = auVar88 & auVar14;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar14,auVar88);
      uVar67 = vmovmskps_avx(auVar88);
      if (uVar67 != 0) {
        auStack_3e8[uVar62] = uVar67 & 0xff;
        uVar97 = vmovlps_avx(local_348);
        *(undefined8 *)(&uStack_228 + uVar62 * 2) = uVar97;
        uVar68 = vmovlps_avx(auVar77);
        auStack_58[uVar62] = uVar68;
        uVar62 = (ulong)((int)uVar62 + 1);
      }
    }
  }
LAB_017ff334:
  if ((int)uVar62 != 0) {
    uVar61 = (int)uVar62 - 1;
    uVar63 = (ulong)uVar61;
    uVar66 = auStack_3e8[uVar63];
    uVar67 = (&uStack_228)[uVar63 * 2];
    fVar96 = afStack_224[uVar63 * 2];
    iVar21 = 0;
    for (uVar68 = (ulong)uVar66; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
      iVar21 = iVar21 + 1;
    }
    uVar66 = uVar66 - 1 & uVar66;
    if (uVar66 == 0) {
      uVar62 = (ulong)uVar61;
    }
    auVar77._8_8_ = 0;
    auVar77._0_8_ = auStack_58[uVar63];
    auStack_3e8[uVar63] = uVar66;
    fVar204 = (float)(iVar21 + 1) * 0.14285715;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * (float)iVar21 * 0.14285715)),ZEXT416(uVar67),
                              ZEXT416((uint)(1.0 - (float)iVar21 * 0.14285715)));
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * fVar204)),ZEXT416(uVar67),
                              ZEXT416((uint)(1.0 - fVar204)));
    auVar197._0_4_ = auVar12._0_4_;
    fVar204 = auVar13._0_4_;
    fVar96 = fVar204 - auVar197._0_4_;
    if (fVar96 < 0.16666667) {
      auVar288 = vshufps_avx(auVar77,auVar77,0x50);
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar3 = vsubps_avx(auVar118,auVar288);
      fVar128 = auVar288._0_4_;
      auVar144._0_4_ = fVar128 * fVar141;
      fVar93 = auVar288._4_4_;
      auVar144._4_4_ = fVar93 * fVar151;
      fVar94 = auVar288._8_4_;
      auVar144._8_4_ = fVar94 * fVar141;
      fVar152 = auVar288._12_4_;
      auVar144._12_4_ = fVar152 * fVar151;
      auVar156._0_4_ = fVar128 * fVar250;
      auVar156._4_4_ = fVar93 * fVar263;
      auVar156._8_4_ = fVar94 * fVar250;
      auVar156._12_4_ = fVar152 * fVar263;
      auVar179._0_4_ = fVar128 * fVar203;
      auVar179._4_4_ = fVar93 * fVar215;
      auVar179._8_4_ = fVar94 * fVar203;
      auVar179._12_4_ = fVar152 * fVar215;
      auVar79._0_4_ = fVar128 * fVar216;
      auVar79._4_4_ = fVar93 * fVar231;
      auVar79._8_4_ = fVar94 * fVar216;
      auVar79._12_4_ = fVar152 * fVar231;
      auVar288 = vfmadd231ps_fma(auVar144,auVar3,auVar189);
      auVar4 = vfmadd231ps_fma(auVar156,auVar3,auVar235);
      auVar254 = vfmadd231ps_fma(auVar179,auVar3,auVar253);
      auVar3 = vfmadd231ps_fma(auVar79,auVar3,auVar268);
      auVar140._16_16_ = auVar288;
      auVar140._0_16_ = auVar288;
      auVar150._16_16_ = auVar4;
      auVar150._0_16_ = auVar4;
      auVar165._16_16_ = auVar254;
      auVar165._0_16_ = auVar254;
      auVar197._4_4_ = auVar197._0_4_;
      auVar197._8_4_ = auVar197._0_4_;
      auVar197._12_4_ = auVar197._0_4_;
      auVar197._20_4_ = fVar204;
      auVar197._16_4_ = fVar204;
      auVar197._24_4_ = fVar204;
      auVar197._28_4_ = fVar204;
      auVar88 = vsubps_avx(auVar150,auVar140);
      auVar4 = vfmadd213ps_fma(auVar88,auVar197,auVar140);
      auVar88 = vsubps_avx(auVar165,auVar150);
      auVar75 = vfmadd213ps_fma(auVar88,auVar197,auVar150);
      auVar288 = vsubps_avx(auVar3,auVar254);
      auVar90._16_16_ = auVar288;
      auVar90._0_16_ = auVar288;
      auVar288 = vfmadd213ps_fma(auVar90,auVar197,auVar165);
      auVar88 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar4));
      auVar3 = vfmadd213ps_fma(auVar88,auVar197,ZEXT1632(auVar4));
      auVar88 = vsubps_avx(ZEXT1632(auVar288),ZEXT1632(auVar75));
      auVar288 = vfmadd213ps_fma(auVar88,auVar197,ZEXT1632(auVar75));
      auVar88 = vsubps_avx(ZEXT1632(auVar288),ZEXT1632(auVar3));
      auVar22 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar88,auVar197);
      fVar232 = auVar88._4_4_ * 3.0;
      fVar128 = fVar96 * 0.33333334;
      local_288._0_8_ =
           CONCAT44(auVar22._4_4_ + fVar128 * fVar232,auVar22._0_4_ + fVar128 * auVar88._0_4_ * 3.0)
      ;
      local_288._8_4_ = auVar22._8_4_ + fVar128 * auVar88._8_4_ * 3.0;
      local_288._12_4_ = auVar22._12_4_ + fVar128 * auVar88._12_4_ * 3.0;
      auVar3 = vshufpd_avx(auVar22,auVar22,3);
      auVar4 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_458 = auVar3;
      auVar288 = vsubps_avx(auVar3,auVar22);
      _local_438 = auVar4;
      auVar254 = vsubps_avx(auVar4,(undefined1  [16])0x0);
      auVar80._0_4_ = auVar288._0_4_ + auVar254._0_4_;
      auVar80._4_4_ = auVar288._4_4_ + auVar254._4_4_;
      auVar80._8_4_ = auVar288._8_4_ + auVar254._8_4_;
      auVar80._12_4_ = auVar288._12_4_ + auVar254._12_4_;
      auVar288 = vshufps_avx(auVar22,auVar22,0xb1);
      auVar254 = vshufps_avx(local_288._0_16_,local_288._0_16_,0xb1);
      auVar277._4_4_ = auVar80._0_4_;
      auVar277._0_4_ = auVar80._0_4_;
      auVar277._8_4_ = auVar80._0_4_;
      auVar277._12_4_ = auVar80._0_4_;
      auVar75 = vshufps_avx(auVar80,auVar80,0x55);
      fVar93 = auVar75._0_4_;
      auVar81._0_4_ = fVar93 * auVar288._0_4_;
      fVar94 = auVar75._4_4_;
      auVar81._4_4_ = fVar94 * auVar288._4_4_;
      fVar152 = auVar75._8_4_;
      auVar81._8_4_ = fVar152 * auVar288._8_4_;
      fVar74 = auVar75._12_4_;
      auVar81._12_4_ = fVar74 * auVar288._12_4_;
      auVar157._0_4_ = fVar93 * auVar254._0_4_;
      auVar157._4_4_ = fVar94 * auVar254._4_4_;
      auVar157._8_4_ = fVar152 * auVar254._8_4_;
      auVar157._12_4_ = fVar74 * auVar254._12_4_;
      auVar135 = vfmadd231ps_fma(auVar81,auVar277,auVar22);
      auVar245 = vfmadd231ps_fma(auVar157,auVar277,local_288._0_16_);
      auVar254 = vshufps_avx(auVar135,auVar135,0xe8);
      auVar75 = vshufps_avx(auVar245,auVar245,0xe8);
      auVar288 = vcmpps_avx(auVar254,auVar75,1);
      uVar67 = vextractps_avx(auVar288,0);
      auVar287 = auVar245;
      if ((uVar67 & 1) == 0) {
        auVar287 = auVar135;
      }
      auVar131._0_4_ = fVar128 * auVar88._16_4_ * 3.0;
      auVar131._4_4_ = fVar128 * fVar232;
      auVar131._8_4_ = fVar128 * auVar88._24_4_ * 3.0;
      auVar131._12_4_ = fVar128 * auVar230._28_4_;
      local_2a8._0_16_ = vsubps_avx((undefined1  [16])0x0,auVar131);
      auVar132 = vshufps_avx(local_2a8._0_16_,local_2a8._0_16_,0xb1);
      auVar76 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar190._0_4_ = fVar93 * auVar132._0_4_;
      auVar190._4_4_ = fVar94 * auVar132._4_4_;
      auVar190._8_4_ = fVar152 * auVar132._8_4_;
      auVar190._12_4_ = fVar74 * auVar132._12_4_;
      auVar208._0_4_ = auVar76._0_4_ * fVar93;
      auVar208._4_4_ = auVar76._4_4_ * fVar94;
      auVar208._8_4_ = auVar76._8_4_ * fVar152;
      auVar208._12_4_ = auVar76._12_4_ * fVar74;
      auVar99 = vfmadd231ps_fma(auVar190,auVar277,local_2a8._0_16_);
      auVar100 = vfmadd231ps_fma(auVar208,(undefined1  [16])0x0,auVar277);
      auVar76 = vshufps_avx(auVar99,auVar99,0xe8);
      auVar98 = vshufps_avx(auVar100,auVar100,0xe8);
      auVar230 = ZEXT1664(auVar98);
      auVar132 = vcmpps_avx(auVar76,auVar98,1);
      uVar67 = vextractps_avx(auVar132,0);
      auVar115 = auVar100;
      if ((uVar67 & 1) == 0) {
        auVar115 = auVar99;
      }
      auVar287 = vmaxss_avx(auVar115,auVar287);
      auVar254 = vminps_avx(auVar254,auVar75);
      auVar75 = vminps_avx(auVar76,auVar98);
      auVar75 = vminps_avx(auVar254,auVar75);
      auVar288 = vshufps_avx(auVar288,auVar288,0x55);
      auVar288 = vblendps_avx(auVar288,auVar132,2);
      auVar132 = vpslld_avx(auVar288,0x1f);
      auVar288 = vshufpd_avx(auVar245,auVar245,1);
      auVar288 = vinsertps_avx(auVar288,auVar100,0x9c);
      auVar254 = vshufpd_avx(auVar135,auVar135,1);
      auVar254 = vinsertps_avx(auVar254,auVar99,0x9c);
      auVar288 = vblendvps_avx(auVar254,auVar288,auVar132);
      auVar254 = vmovshdup_avx(auVar288);
      auVar288 = vmaxss_avx(auVar254,auVar288);
      fVar152 = auVar75._0_4_;
      auVar254 = vmovshdup_avx(auVar75);
      fVar94 = auVar288._0_4_;
      fVar128 = auVar254._0_4_;
      fVar93 = auVar287._0_4_;
      if (((0.0001 <= fVar152) || (fVar94 <= -0.0001)) && (0.0001 <= fVar128 || fVar94 <= -0.0001))
      goto code_r0x017ff648;
      goto LAB_017ff66f;
    }
    local_348 = vinsertps_avx(auVar12,auVar13,0x10);
    goto LAB_017fed8f;
  }
  if (bVar69 != false) {
    return bVar69;
  }
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar91._4_4_ = uVar73;
  auVar91._0_4_ = uVar73;
  auVar91._8_4_ = uVar73;
  auVar91._12_4_ = uVar73;
  auVar91._16_4_ = uVar73;
  auVar91._20_4_ = uVar73;
  auVar91._24_4_ = uVar73;
  auVar91._28_4_ = uVar73;
  auVar88 = vcmpps_avx(local_178,auVar91,2);
  uVar60 = vmovmskps_avx(auVar88);
  uVar60 = (uint)uVar70 & uVar60;
  context = pRVar59;
  if (uVar60 == 0) {
    return false;
  }
  goto LAB_017fe5c9;
code_r0x017ff648:
  auVar254 = vcmpps_avx(auVar254,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar135 = vcmpps_avx(auVar75,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar254 = vandps_avx(auVar135,auVar254);
  if (fVar93 <= -0.0001 || (auVar254 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_017ff334;
LAB_017ff66f:
  auVar135 = vcmpps_avx(auVar75,_DAT_01f7aa10,1);
  auVar245 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar254 = vcmpss_avx(auVar287,ZEXT816(0) << 0x20,1);
  auVar101._8_4_ = 0xbf800000;
  auVar101._0_8_ = 0xbf800000bf800000;
  auVar101._12_4_ = 0xbf800000;
  auVar254 = vblendvps_avx(auVar118,auVar101,auVar254);
  auVar135 = vblendvps_avx(auVar118,auVar101,auVar135);
  fVar232 = auVar135._0_4_;
  fVar74 = auVar254._0_4_;
  auVar254 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar232 == fVar74) && (!NAN(fVar232) && !NAN(fVar74))) {
    auVar254 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar232 == fVar74) && (!NAN(fVar232) && !NAN(fVar74))) {
    auVar245 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar135 = vmovshdup_avx(auVar135);
  fVar264 = auVar135._0_4_;
  if ((fVar232 != fVar264) || (NAN(fVar232) || NAN(fVar264))) {
    auVar191._12_4_ = 0;
    auVar191._0_12_ = ZEXT812(0);
    auVar191 = auVar191 << 0x20;
    if ((fVar128 != fVar152) || (NAN(fVar128) || NAN(fVar152))) {
      auVar133._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar133._8_4_ = auVar75._8_4_ ^ 0x80000000;
      auVar133._12_4_ = auVar75._12_4_ ^ 0x80000000;
      auVar134._0_4_ = -fVar152 / (fVar128 - fVar152);
      auVar134._4_12_ = auVar133._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar134._0_4_)),auVar191,auVar134);
      auVar135 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar152 != 0.0) || (auVar135 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar152))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar135 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar75);
    auVar245 = vmaxss_avx(auVar135,auVar245);
  }
  else {
    auVar54._12_4_ = 0;
    auVar54._0_12_ = ZEXT812(0);
    auVar191 = auVar54 << 0x20;
  }
  auVar288 = vcmpss_avx(auVar288,auVar191,1);
  auVar102._8_4_ = 0xbf800000;
  auVar102._0_8_ = 0xbf800000bf800000;
  auVar102._12_4_ = 0xbf800000;
  auVar288 = vblendvps_avx(auVar118,auVar102,auVar288);
  fVar128 = auVar288._0_4_;
  auVar288 = SUB6416(ZEXT464(0x3f800000),0);
  if ((fVar74 != fVar128) || (NAN(fVar74) || NAN(fVar128))) {
    if ((fVar94 != fVar93) || (NAN(fVar94) || NAN(fVar93))) {
      auVar82._0_8_ = auVar287._0_8_ ^ 0x8000000080000000;
      auVar82._8_4_ = auVar287._8_4_ ^ 0x80000000;
      auVar82._12_4_ = auVar287._12_4_ ^ 0x80000000;
      auVar136._0_4_ = -fVar93 / (fVar94 - fVar93);
      auVar136._4_12_ = auVar82._4_12_;
      auVar75 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar136._0_4_)),auVar191,auVar136);
      auVar135 = auVar75;
    }
    else {
      auVar75 = ZEXT816(0) << 0x20;
      if ((fVar93 != 0.0) || (auVar135 = auVar288, NAN(fVar93))) {
        auVar75 = SUB6416(ZEXT464(0x7f800000),0);
        auVar135 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar254 = vminss_avx(auVar254,auVar75);
    auVar245 = vmaxss_avx(auVar135,auVar245);
  }
  if ((fVar264 != fVar128) || (NAN(fVar264) || NAN(fVar128))) {
    auVar254 = vminss_avx(auVar254,auVar288);
    auVar245 = vmaxss_avx(auVar288,auVar245);
  }
  auVar254 = vmaxss_avx(auVar191,auVar254);
  auVar75 = vminss_avx(auVar245,auVar288);
  if (auVar75._0_4_ < auVar254._0_4_) goto LAB_017ff334;
  auVar254 = vmaxss_avx(auVar191,ZEXT416((uint)(auVar254._0_4_ + -0.1)));
  auVar288 = vminss_avx(ZEXT416((uint)(auVar75._0_4_ + 0.1)),auVar288);
  auVar145._0_8_ = auVar22._0_8_;
  auVar145._8_8_ = auVar145._0_8_;
  auVar221._8_8_ = local_288._0_8_;
  auVar221._0_8_ = local_288._0_8_;
  auVar236._8_8_ = local_2a8._0_8_;
  auVar236._0_8_ = local_2a8._0_8_;
  auVar75 = vshufpd_avx(local_288._0_16_,local_288._0_16_,3);
  auVar135 = vshufpd_avx(local_2a8._0_16_,local_2a8._0_16_,3);
  auVar245 = vshufps_avx(auVar254,auVar288,0);
  auVar22 = vsubps_avx(auVar118,auVar245);
  local_458._0_4_ = auVar3._0_4_;
  local_458._4_4_ = auVar3._4_4_;
  fStack_450 = auVar3._8_4_;
  fStack_44c = auVar3._12_4_;
  fVar128 = auVar245._0_4_;
  auVar83._0_4_ = fVar128 * (float)local_458._0_4_;
  fVar93 = auVar245._4_4_;
  auVar83._4_4_ = fVar93 * (float)local_458._4_4_;
  fVar94 = auVar245._8_4_;
  auVar83._8_4_ = fVar94 * fStack_450;
  fVar152 = auVar245._12_4_;
  auVar83._12_4_ = fVar152 * fStack_44c;
  auVar180._0_4_ = fVar128 * auVar75._0_4_;
  auVar180._4_4_ = fVar93 * auVar75._4_4_;
  auVar180._8_4_ = fVar94 * auVar75._8_4_;
  auVar180._12_4_ = fVar152 * auVar75._12_4_;
  auVar192._0_4_ = fVar128 * auVar135._0_4_;
  auVar192._4_4_ = fVar93 * auVar135._4_4_;
  auVar192._8_4_ = fVar94 * auVar135._8_4_;
  auVar192._12_4_ = fVar152 * auVar135._12_4_;
  local_438._0_4_ = auVar4._0_4_;
  local_438._4_4_ = auVar4._4_4_;
  fStack_430 = auVar4._8_4_;
  fStack_42c = auVar4._12_4_;
  auVar209._0_4_ = fVar128 * (float)local_438._0_4_;
  auVar209._4_4_ = fVar93 * (float)local_438._4_4_;
  auVar209._8_4_ = fVar94 * fStack_430;
  auVar209._12_4_ = fVar152 * fStack_42c;
  auVar75 = vfmadd231ps_fma(auVar83,auVar22,auVar145);
  auVar135 = vfmadd231ps_fma(auVar180,auVar22,auVar221);
  auVar245 = vfmadd231ps_fma(auVar192,auVar22,auVar236);
  auVar22 = vfmadd231ps_fma(auVar209,auVar22,ZEXT816(0));
  auVar3 = vmovshdup_avx(auVar77);
  auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * auVar254._0_4_)),auVar77,
                            ZEXT416((uint)(1.0 - auVar254._0_4_)));
  auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * auVar288._0_4_)),auVar77,
                            ZEXT416((uint)(1.0 - auVar288._0_4_)));
  fVar128 = 1.0 / fVar96;
  auVar288 = vsubps_avx(auVar135,auVar75);
  auVar222._0_4_ = auVar288._0_4_ * 3.0;
  auVar222._4_4_ = auVar288._4_4_ * 3.0;
  auVar222._8_4_ = auVar288._8_4_ * 3.0;
  auVar222._12_4_ = auVar288._12_4_ * 3.0;
  auVar288 = vsubps_avx(auVar245,auVar135);
  auVar237._0_4_ = auVar288._0_4_ * 3.0;
  auVar237._4_4_ = auVar288._4_4_ * 3.0;
  auVar237._8_4_ = auVar288._8_4_ * 3.0;
  auVar237._12_4_ = auVar288._12_4_ * 3.0;
  auVar288 = vsubps_avx(auVar22,auVar245);
  auVar246._0_4_ = auVar288._0_4_ * 3.0;
  auVar246._4_4_ = auVar288._4_4_ * 3.0;
  auVar246._8_4_ = auVar288._8_4_ * 3.0;
  auVar246._12_4_ = auVar288._12_4_ * 3.0;
  auVar3 = vminps_avx(auVar237,auVar246);
  auVar288 = vmaxps_avx(auVar237,auVar246);
  auVar3 = vminps_avx(auVar222,auVar3);
  auVar288 = vmaxps_avx(auVar222,auVar288);
  auVar4 = vshufpd_avx(auVar3,auVar3,3);
  auVar254 = vshufpd_avx(auVar288,auVar288,3);
  auVar3 = vminps_avx(auVar3,auVar4);
  auVar288 = vmaxps_avx(auVar288,auVar254);
  auVar238._0_4_ = auVar3._0_4_ * fVar128;
  auVar238._4_4_ = auVar3._4_4_ * fVar128;
  auVar238._8_4_ = auVar3._8_4_ * fVar128;
  auVar238._12_4_ = auVar3._12_4_ * fVar128;
  auVar223._0_4_ = auVar288._0_4_ * fVar128;
  auVar223._4_4_ = auVar288._4_4_ * fVar128;
  auVar223._8_4_ = auVar288._8_4_ * fVar128;
  auVar223._12_4_ = auVar288._12_4_ * fVar128;
  fVar128 = 1.0 / (auVar99._0_4_ - auVar98._0_4_);
  auVar288 = vshufpd_avx(auVar75,auVar75,3);
  auVar3 = vshufpd_avx(auVar135,auVar135,3);
  auVar4 = vshufpd_avx(auVar245,auVar245,3);
  auVar254 = vshufpd_avx(auVar22,auVar22,3);
  auVar288 = vsubps_avx(auVar288,auVar75);
  auVar75 = vsubps_avx(auVar3,auVar135);
  auVar77 = vsubps_avx(auVar4,auVar245);
  auVar254 = vsubps_avx(auVar254,auVar22);
  auVar3 = vminps_avx(auVar288,auVar75);
  auVar288 = vmaxps_avx(auVar288,auVar75);
  auVar4 = vminps_avx(auVar77,auVar254);
  auVar4 = vminps_avx(auVar3,auVar4);
  auVar3 = vmaxps_avx(auVar77,auVar254);
  auVar288 = vmaxps_avx(auVar288,auVar3);
  auVar269._0_4_ = fVar128 * auVar4._0_4_;
  auVar269._4_4_ = fVar128 * auVar4._4_4_;
  auVar269._8_4_ = fVar128 * auVar4._8_4_;
  auVar269._12_4_ = fVar128 * auVar4._12_4_;
  auVar255._0_4_ = fVar128 * auVar288._0_4_;
  auVar255._4_4_ = fVar128 * auVar288._4_4_;
  auVar255._8_4_ = fVar128 * auVar288._8_4_;
  auVar255._12_4_ = fVar128 * auVar288._12_4_;
  auVar254 = vinsertps_avx(auVar12,auVar98,0x10);
  auVar75 = vinsertps_avx(auVar13,auVar99,0x10);
  auVar247._0_4_ = (auVar254._0_4_ + auVar75._0_4_) * 0.5;
  auVar247._4_4_ = (auVar254._4_4_ + auVar75._4_4_) * 0.5;
  auVar247._8_4_ = (auVar254._8_4_ + auVar75._8_4_) * 0.5;
  auVar247._12_4_ = (auVar254._12_4_ + auVar75._12_4_) * 0.5;
  auVar84._4_4_ = auVar247._0_4_;
  auVar84._0_4_ = auVar247._0_4_;
  auVar84._8_4_ = auVar247._0_4_;
  auVar84._12_4_ = auVar247._0_4_;
  auVar288 = vfmadd213ps_fma(local_2b8,auVar84,local_3f8);
  auVar3 = vfmadd213ps_fma(local_2c8,auVar84,local_408);
  auVar4 = vfmadd213ps_fma(local_2d8,auVar84,local_418);
  auVar13 = vsubps_avx(auVar3,auVar288);
  auVar288 = vfmadd213ps_fma(auVar13,auVar84,auVar288);
  auVar13 = vsubps_avx(auVar4,auVar3);
  auVar13 = vfmadd213ps_fma(auVar13,auVar84,auVar3);
  auVar13 = vsubps_avx(auVar13,auVar288);
  auVar288 = vfmadd231ps_fma(auVar288,auVar13,auVar84);
  auVar85._0_8_ = CONCAT44(auVar13._4_4_ * 3.0,auVar13._0_4_ * 3.0);
  auVar85._8_4_ = auVar13._8_4_ * 3.0;
  auVar85._12_4_ = auVar13._12_4_ * 3.0;
  auVar278._8_8_ = auVar288._0_8_;
  auVar278._0_8_ = auVar288._0_8_;
  auVar13 = vshufpd_avx(auVar288,auVar288,3);
  auVar288 = vshufps_avx(auVar247,auVar247,0x55);
  auVar135 = vsubps_avx(auVar13,auVar278);
  auVar22 = vfmadd231ps_fma(auVar278,auVar288,auVar135);
  auVar289._8_8_ = auVar85._0_8_;
  auVar289._0_8_ = auVar85._0_8_;
  auVar13 = vshufpd_avx(auVar85,auVar85,3);
  auVar13 = vsubps_avx(auVar13,auVar289);
  auVar245 = vfmadd213ps_fma(auVar13,auVar288,auVar289);
  auVar288 = vmovshdup_avx(auVar245);
  auVar290._0_8_ = auVar288._0_8_ ^ 0x8000000080000000;
  auVar290._8_4_ = auVar288._8_4_ ^ 0x80000000;
  auVar290._12_4_ = auVar288._12_4_ ^ 0x80000000;
  auVar3 = vmovshdup_avx(auVar135);
  auVar13 = vunpcklps_avx(auVar3,auVar290);
  auVar4 = vshufps_avx(auVar13,auVar290,4);
  auVar77 = vshufps_avx(auVar247,auVar247,0x54);
  auVar137._0_8_ = auVar135._0_8_ ^ 0x8000000080000000;
  auVar137._8_4_ = auVar135._8_4_ ^ 0x80000000;
  auVar137._12_4_ = auVar135._12_4_ ^ 0x80000000;
  auVar13 = vmovlhps_avx(auVar137,auVar245);
  auVar13 = vshufps_avx(auVar13,auVar245,8);
  auVar288 = vfmsub231ss_fma(ZEXT416((uint)(auVar135._0_4_ * auVar288._0_4_)),auVar3,auVar245);
  uVar73 = auVar288._0_4_;
  auVar86._4_4_ = uVar73;
  auVar86._0_4_ = uVar73;
  auVar86._8_4_ = uVar73;
  auVar86._12_4_ = uVar73;
  auVar288 = vdivps_avx(auVar4,auVar86);
  auVar3 = vdivps_avx(auVar13,auVar86);
  fVar94 = auVar22._0_4_;
  fVar128 = auVar288._0_4_;
  auVar13 = vshufps_avx(auVar22,auVar22,0x55);
  fVar93 = auVar3._0_4_;
  auVar87._0_4_ = fVar94 * fVar128 + auVar13._0_4_ * fVar93;
  auVar87._4_4_ = fVar94 * auVar288._4_4_ + auVar13._4_4_ * auVar3._4_4_;
  auVar87._8_4_ = fVar94 * auVar288._8_4_ + auVar13._8_4_ * auVar3._8_4_;
  auVar87._12_4_ = fVar94 * auVar288._12_4_ + auVar13._12_4_ * auVar3._12_4_;
  auVar76 = vsubps_avx(auVar77,auVar87);
  auVar77 = vmovshdup_avx(auVar288);
  auVar13 = vinsertps_avx(auVar238,auVar269,0x1c);
  auVar158._0_4_ = auVar77._0_4_ * auVar13._0_4_;
  auVar158._4_4_ = auVar77._4_4_ * auVar13._4_4_;
  auVar158._8_4_ = auVar77._8_4_ * auVar13._8_4_;
  auVar158._12_4_ = auVar77._12_4_ * auVar13._12_4_;
  auVar4 = vinsertps_avx(auVar223,auVar255,0x1c);
  auVar103._0_4_ = auVar4._0_4_ * auVar77._0_4_;
  auVar103._4_4_ = auVar4._4_4_ * auVar77._4_4_;
  auVar103._8_4_ = auVar4._8_4_ * auVar77._8_4_;
  auVar103._12_4_ = auVar4._12_4_ * auVar77._12_4_;
  auVar22 = vminps_avx(auVar158,auVar103);
  auVar245 = vmaxps_avx(auVar103,auVar158);
  auVar77 = vinsertps_avx(auVar269,auVar238,0x4c);
  auVar287 = vmovshdup_avx(auVar3);
  auVar135 = vinsertps_avx(auVar255,auVar223,0x4c);
  auVar256._0_4_ = auVar287._0_4_ * auVar77._0_4_;
  auVar256._4_4_ = auVar287._4_4_ * auVar77._4_4_;
  auVar256._8_4_ = auVar287._8_4_ * auVar77._8_4_;
  auVar256._12_4_ = auVar287._12_4_ * auVar77._12_4_;
  auVar239._0_4_ = auVar287._0_4_ * auVar135._0_4_;
  auVar239._4_4_ = auVar287._4_4_ * auVar135._4_4_;
  auVar239._8_4_ = auVar287._8_4_ * auVar135._8_4_;
  auVar239._12_4_ = auVar287._12_4_ * auVar135._12_4_;
  auVar287 = vminps_avx(auVar256,auVar239);
  auVar270._0_4_ = auVar22._0_4_ + auVar287._0_4_;
  auVar270._4_4_ = auVar22._4_4_ + auVar287._4_4_;
  auVar270._8_4_ = auVar22._8_4_ + auVar287._8_4_;
  auVar270._12_4_ = auVar22._12_4_ + auVar287._12_4_;
  auVar22 = vmaxps_avx(auVar239,auVar256);
  auVar104._0_4_ = auVar22._0_4_ + auVar245._0_4_;
  auVar104._4_4_ = auVar22._4_4_ + auVar245._4_4_;
  auVar104._8_4_ = auVar22._8_4_ + auVar245._8_4_;
  auVar104._12_4_ = auVar22._12_4_ + auVar245._12_4_;
  auVar240._8_8_ = 0x3f80000000000000;
  auVar240._0_8_ = 0x3f80000000000000;
  auVar245 = vsubps_avx(auVar240,auVar104);
  auVar22 = vsubps_avx(auVar240,auVar270);
  auVar287 = vsubps_avx(auVar254,auVar247);
  auVar132 = vsubps_avx(auVar75,auVar247);
  auVar119._0_4_ = fVar128 * auVar13._0_4_;
  auVar119._4_4_ = fVar128 * auVar13._4_4_;
  auVar119._8_4_ = fVar128 * auVar13._8_4_;
  auVar119._12_4_ = fVar128 * auVar13._12_4_;
  auVar271._0_4_ = fVar128 * auVar4._0_4_;
  auVar271._4_4_ = fVar128 * auVar4._4_4_;
  auVar271._8_4_ = fVar128 * auVar4._8_4_;
  auVar271._12_4_ = fVar128 * auVar4._12_4_;
  auVar4 = vminps_avx(auVar119,auVar271);
  auVar13 = vmaxps_avx(auVar271,auVar119);
  auVar159._0_4_ = fVar93 * auVar77._0_4_;
  auVar159._4_4_ = fVar93 * auVar77._4_4_;
  auVar159._8_4_ = fVar93 * auVar77._8_4_;
  auVar159._12_4_ = fVar93 * auVar77._12_4_;
  auVar224._0_4_ = fVar93 * auVar135._0_4_;
  auVar224._4_4_ = fVar93 * auVar135._4_4_;
  auVar224._8_4_ = fVar93 * auVar135._8_4_;
  auVar224._12_4_ = fVar93 * auVar135._12_4_;
  auVar77 = vminps_avx(auVar159,auVar224);
  auVar272._0_4_ = auVar4._0_4_ + auVar77._0_4_;
  auVar272._4_4_ = auVar4._4_4_ + auVar77._4_4_;
  auVar272._8_4_ = auVar4._8_4_ + auVar77._8_4_;
  auVar272._12_4_ = auVar4._12_4_ + auVar77._12_4_;
  fVar264 = auVar287._0_4_;
  auVar279._0_4_ = fVar264 * auVar245._0_4_;
  fVar265 = auVar287._4_4_;
  auVar279._4_4_ = fVar265 * auVar245._4_4_;
  fVar198 = auVar287._8_4_;
  auVar279._8_4_ = fVar198 * auVar245._8_4_;
  fVar199 = auVar287._12_4_;
  auVar279._12_4_ = fVar199 * auVar245._12_4_;
  auVar4 = vmaxps_avx(auVar224,auVar159);
  auVar225._0_4_ = fVar264 * auVar22._0_4_;
  auVar225._4_4_ = fVar265 * auVar22._4_4_;
  auVar225._8_4_ = fVar198 * auVar22._8_4_;
  auVar225._12_4_ = fVar199 * auVar22._12_4_;
  fVar94 = auVar132._0_4_;
  auVar105._0_4_ = fVar94 * auVar245._0_4_;
  fVar152 = auVar132._4_4_;
  auVar105._4_4_ = fVar152 * auVar245._4_4_;
  fVar74 = auVar132._8_4_;
  auVar105._8_4_ = fVar74 * auVar245._8_4_;
  fVar232 = auVar132._12_4_;
  auVar105._12_4_ = fVar232 * auVar245._12_4_;
  auVar241._0_4_ = fVar94 * auVar22._0_4_;
  auVar241._4_4_ = fVar152 * auVar22._4_4_;
  auVar241._8_4_ = fVar74 * auVar22._8_4_;
  auVar241._12_4_ = fVar232 * auVar22._12_4_;
  auVar120._0_4_ = auVar13._0_4_ + auVar4._0_4_;
  auVar120._4_4_ = auVar13._4_4_ + auVar4._4_4_;
  auVar120._8_4_ = auVar13._8_4_ + auVar4._8_4_;
  auVar120._12_4_ = auVar13._12_4_ + auVar4._12_4_;
  auVar160._8_8_ = 0x3f800000;
  auVar160._0_8_ = 0x3f800000;
  auVar13 = vsubps_avx(auVar160,auVar120);
  auVar4 = vsubps_avx(auVar160,auVar272);
  auVar273._0_4_ = fVar264 * auVar13._0_4_;
  auVar273._4_4_ = fVar265 * auVar13._4_4_;
  auVar273._8_4_ = fVar198 * auVar13._8_4_;
  auVar273._12_4_ = fVar199 * auVar13._12_4_;
  auVar257._0_4_ = fVar264 * auVar4._0_4_;
  auVar257._4_4_ = fVar265 * auVar4._4_4_;
  auVar257._8_4_ = fVar198 * auVar4._8_4_;
  auVar257._12_4_ = fVar199 * auVar4._12_4_;
  auVar121._0_4_ = fVar94 * auVar13._0_4_;
  auVar121._4_4_ = fVar152 * auVar13._4_4_;
  auVar121._8_4_ = fVar74 * auVar13._8_4_;
  auVar121._12_4_ = fVar232 * auVar13._12_4_;
  auVar161._0_4_ = fVar94 * auVar4._0_4_;
  auVar161._4_4_ = fVar152 * auVar4._4_4_;
  auVar161._8_4_ = fVar74 * auVar4._8_4_;
  auVar161._12_4_ = fVar232 * auVar4._12_4_;
  auVar13 = vminps_avx(auVar273,auVar257);
  auVar4 = vminps_avx(auVar121,auVar161);
  auVar13 = vminps_avx(auVar13,auVar4);
  auVar4 = vmaxps_avx(auVar257,auVar273);
  auVar77 = vmaxps_avx(auVar161,auVar121);
  auVar135 = vminps_avx(auVar279,auVar225);
  auVar245 = vminps_avx(auVar105,auVar241);
  auVar135 = vminps_avx(auVar135,auVar245);
  auVar13 = vhaddps_avx(auVar13,auVar135);
  auVar4 = vmaxps_avx(auVar77,auVar4);
  auVar77 = vmaxps_avx(auVar225,auVar279);
  auVar135 = vmaxps_avx(auVar241,auVar105);
  auVar77 = vmaxps_avx(auVar135,auVar77);
  auVar4 = vhaddps_avx(auVar4,auVar77);
  auVar13 = vshufps_avx(auVar13,auVar13,0xe8);
  auVar4 = vshufps_avx(auVar4,auVar4,0xe8);
  auVar242._0_4_ = auVar76._0_4_ + auVar13._0_4_;
  auVar242._4_4_ = auVar76._4_4_ + auVar13._4_4_;
  auVar242._8_4_ = auVar76._8_4_ + auVar13._8_4_;
  auVar242._12_4_ = auVar76._12_4_ + auVar13._12_4_;
  auVar226._0_4_ = auVar76._0_4_ + auVar4._0_4_;
  auVar226._4_4_ = auVar76._4_4_ + auVar4._4_4_;
  auVar226._8_4_ = auVar76._8_4_ + auVar4._8_4_;
  auVar226._12_4_ = auVar76._12_4_ + auVar4._12_4_;
  auVar230 = ZEXT1664(auVar226);
  auVar13 = vmaxps_avx(auVar254,auVar242);
  auVar4 = vminps_avx(auVar226,auVar75);
  auVar13 = vcmpps_avx(auVar4,auVar13,1);
  auVar13 = vshufps_avx(auVar13,auVar13,0x50);
  if ((auVar13 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar13[0xf] < '\0')
  goto LAB_017ff334;
  bVar65 = 0;
  if (auVar242._0_4_ <= auVar197._0_4_) {
    auVar274._8_4_ = 0x7fffffff;
    auVar274._0_8_ = 0x7fffffff7fffffff;
    auVar274._12_4_ = 0x7fffffff;
  }
  else {
    auVar274._8_4_ = 0x7fffffff;
    auVar274._0_8_ = 0x7fffffff7fffffff;
    auVar274._12_4_ = 0x7fffffff;
    bVar65 = 0;
    if (auVar226._0_4_ < auVar75._0_4_) {
      auVar4 = vmovshdup_avx(auVar242);
      auVar13 = vcmpps_avx(auVar226,auVar75,1);
      bVar65 = auVar13[4] & auVar98._0_4_ < auVar4._0_4_;
    }
  }
  if (((3 < (uint)uVar62 || fVar96 < 0.001) | bVar65) == 1) {
    lVar64 = 200;
    auVar230 = ZEXT1664(local_408);
    do {
      fVar152 = auVar76._0_4_;
      fVar94 = 1.0 - fVar152;
      fVar96 = fVar94 * fVar94 * fVar94;
      fVar204 = fVar152 * 3.0 * fVar94 * fVar94;
      fVar94 = fVar94 * fVar152 * fVar152 * 3.0;
      auVar146._4_4_ = fVar96;
      auVar146._0_4_ = fVar96;
      auVar146._8_4_ = fVar96;
      auVar146._12_4_ = fVar96;
      auVar122._4_4_ = fVar204;
      auVar122._0_4_ = fVar204;
      auVar122._8_4_ = fVar204;
      auVar122._12_4_ = fVar204;
      auVar106._4_4_ = fVar94;
      auVar106._0_4_ = fVar94;
      auVar106._8_4_ = fVar94;
      auVar106._12_4_ = fVar94;
      fVar152 = fVar152 * fVar152 * fVar152;
      auVar162._0_4_ = (float)local_468._0_4_ * fVar152;
      auVar162._4_4_ = (float)local_468._4_4_ * fVar152;
      auVar162._8_4_ = fStack_460 * fVar152;
      auVar162._12_4_ = fStack_45c * fVar152;
      auVar12 = vfmadd231ps_fma(auVar162,local_418,auVar106);
      auVar12 = vfmadd231ps_fma(auVar12,local_408,auVar122);
      auVar12 = vfmadd231ps_fma(auVar12,local_3f8,auVar146);
      auVar107._8_8_ = auVar12._0_8_;
      auVar107._0_8_ = auVar12._0_8_;
      auVar12 = vshufpd_avx(auVar12,auVar12,3);
      auVar13 = vshufps_avx(auVar76,auVar76,0x55);
      auVar12 = vsubps_avx(auVar12,auVar107);
      auVar13 = vfmadd213ps_fma(auVar12,auVar13,auVar107);
      fVar96 = auVar13._0_4_;
      auVar12 = vshufps_avx(auVar13,auVar13,0x55);
      auVar108._0_4_ = fVar128 * fVar96 + fVar93 * auVar12._0_4_;
      auVar108._4_4_ = auVar288._4_4_ * fVar96 + auVar3._4_4_ * auVar12._4_4_;
      auVar108._8_4_ = auVar288._8_4_ * fVar96 + auVar3._8_4_ * auVar12._8_4_;
      auVar108._12_4_ = auVar288._12_4_ * fVar96 + auVar3._12_4_ * auVar12._12_4_;
      auVar76 = vsubps_avx(auVar76,auVar108);
      auVar12 = vandps_avx(auVar274,auVar13);
      auVar13 = vshufps_avx(auVar12,auVar12,0xf5);
      auVar12 = vmaxss_avx(auVar13,auVar12);
      if (auVar12._0_4_ < fVar92) {
        local_1d8 = auVar76._0_4_;
        if ((0.0 <= local_1d8) && (local_1d8 <= 1.0)) {
          auVar12 = vmovshdup_avx(auVar76);
          fVar96 = auVar12._0_4_;
          if ((0.0 <= fVar96) && (fVar96 <= 1.0)) {
            auVar12 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                    ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
            auVar77 = vinsertps_avx(auVar12,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                   );
            auVar12 = vdpps_avx(auVar77,local_478,0x7f);
            auVar13 = vdpps_avx(auVar77,local_488,0x7f);
            auVar288 = vdpps_avx(auVar77,local_2e8,0x7f);
            auVar3 = vdpps_avx(auVar77,local_2f8,0x7f);
            auVar4 = vdpps_avx(auVar77,local_308,0x7f);
            auVar254 = vdpps_avx(auVar77,local_318,0x7f);
            auVar75 = vdpps_avx(auVar77,local_328,0x7f);
            auVar77 = vdpps_avx(auVar77,local_338,0x7f);
            fVar204 = 1.0 - fVar96;
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * auVar4._0_4_)),ZEXT416((uint)fVar204),
                                      auVar12);
            auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar254._0_4_ * fVar96)),
                                      ZEXT416((uint)fVar204),auVar13);
            auVar288 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar96)),
                                       ZEXT416((uint)fVar204),auVar288);
            auVar230 = ZEXT1664(auVar288);
            auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar96 * auVar77._0_4_)),ZEXT416((uint)fVar204),
                                     auVar3);
            fVar93 = 1.0 - local_1d8;
            fVar96 = fVar93 * local_1d8 * local_1d8 * 3.0;
            fVar152 = local_1d8 * local_1d8 * local_1d8;
            auVar288 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * fVar152)),ZEXT416((uint)fVar96)
                                       ,auVar288);
            fVar204 = local_1d8 * 3.0 * fVar93 * fVar93;
            auVar13 = vfmadd231ss_fma(auVar288,ZEXT416((uint)fVar204),auVar13);
            fVar128 = fVar93 * fVar93 * fVar93;
            auVar12 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar128),auVar12);
            fVar94 = auVar12._0_4_;
            if ((fVar72 <= fVar94) && (fVar74 = *(float *)(ray + k * 4 + 0x80), fVar94 <= fVar74)) {
              pGVar8 = (pRVar59->scene->geometries).items[uVar60].ptr;
              if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar71 = false;
              }
              else if ((pRVar59->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar71 = true, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_1c8 = vshufps_avx(auVar76,auVar76,0x55);
                auVar210._8_4_ = 0x3f800000;
                auVar210._0_8_ = 0x3f8000003f800000;
                auVar210._12_4_ = 0x3f800000;
                auVar12 = vsubps_avx(auVar210,local_1c8);
                fVar232 = local_1c8._0_4_;
                auVar227._0_4_ = fVar232 * (float)local_4a8._0_4_;
                fVar264 = local_1c8._4_4_;
                auVar227._4_4_ = fVar264 * (float)local_4a8._4_4_;
                fVar265 = local_1c8._8_4_;
                auVar227._8_4_ = fVar265 * fStack_4a0;
                fVar198 = local_1c8._12_4_;
                auVar227._12_4_ = fVar198 * fStack_49c;
                auVar243._0_4_ = fVar232 * (float)local_4e8._0_4_;
                auVar243._4_4_ = fVar264 * (float)local_4e8._4_4_;
                auVar243._8_4_ = fVar265 * fStack_4e0;
                auVar243._12_4_ = fVar198 * fStack_4dc;
                auVar248._0_4_ = fVar232 * (float)local_4f8._0_4_;
                auVar248._4_4_ = fVar264 * (float)local_4f8._4_4_;
                auVar248._8_4_ = fVar265 * fStack_4f0;
                auVar248._12_4_ = fVar198 * fStack_4ec;
                auVar258._0_4_ = fVar232 * fVar166;
                auVar258._4_4_ = fVar264 * fVar183;
                auVar258._8_4_ = fVar265 * fVar184;
                auVar258._12_4_ = fVar198 * fVar185;
                auVar13 = vfmadd231ps_fma(auVar227,auVar12,local_498);
                auVar288 = vfmadd231ps_fma(auVar243,auVar12,local_4c8);
                auVar3 = vfmadd231ps_fma(auVar248,auVar12,local_4d8);
                auVar4 = vfmadd231ps_fma(auVar258,auVar12,local_4b8);
                auVar12 = vsubps_avx(auVar288,auVar13);
                auVar13 = vsubps_avx(auVar3,auVar288);
                auVar230 = ZEXT1664(auVar13);
                auVar288 = vsubps_avx(auVar4,auVar3);
                auVar249._0_4_ = auVar13._0_4_ * local_1d8;
                auVar249._4_4_ = auVar13._4_4_ * local_1d8;
                auVar249._8_4_ = auVar13._8_4_ * local_1d8;
                auVar249._12_4_ = auVar13._12_4_ * local_1d8;
                auVar181._4_4_ = fVar93;
                auVar181._0_4_ = fVar93;
                auVar181._8_4_ = fVar93;
                auVar181._12_4_ = fVar93;
                auVar12 = vfmadd231ps_fma(auVar249,auVar181,auVar12);
                auVar211._0_4_ = auVar288._0_4_ * local_1d8;
                auVar211._4_4_ = auVar288._4_4_ * local_1d8;
                auVar211._8_4_ = auVar288._8_4_ * local_1d8;
                auVar211._12_4_ = auVar288._12_4_ * local_1d8;
                auVar288 = vfmadd231ps_fma(auVar211,auVar181,auVar13);
                auVar212._0_4_ = auVar288._0_4_ * local_1d8;
                auVar212._4_4_ = auVar288._4_4_ * local_1d8;
                auVar212._8_4_ = auVar288._8_4_ * local_1d8;
                auVar212._12_4_ = auVar288._12_4_ * local_1d8;
                auVar288 = vfmadd231ps_fma(auVar212,auVar181,auVar12);
                auVar163._0_4_ = fVar152 * (float)local_3a8._0_4_;
                auVar163._4_4_ = fVar152 * (float)local_3a8._4_4_;
                auVar163._8_4_ = fVar152 * fStack_3a0;
                auVar163._12_4_ = fVar152 * fStack_39c;
                auVar123._4_4_ = fVar96;
                auVar123._0_4_ = fVar96;
                auVar123._8_4_ = fVar96;
                auVar123._12_4_ = fVar96;
                auVar12 = vfmadd132ps_fma(auVar123,auVar163,local_398);
                auVar147._4_4_ = fVar204;
                auVar147._0_4_ = fVar204;
                auVar147._8_4_ = fVar204;
                auVar147._12_4_ = fVar204;
                auVar12 = vfmadd132ps_fma(auVar147,auVar12,local_388);
                auVar124._0_4_ = auVar288._0_4_ * 3.0;
                auVar124._4_4_ = auVar288._4_4_ * 3.0;
                auVar124._8_4_ = auVar288._8_4_ * 3.0;
                auVar124._12_4_ = auVar288._12_4_ * 3.0;
                auVar138._4_4_ = fVar128;
                auVar138._0_4_ = fVar128;
                auVar138._8_4_ = fVar128;
                auVar138._12_4_ = fVar128;
                auVar288 = vfmadd132ps_fma(auVar138,auVar12,local_378);
                auVar12 = vshufps_avx(auVar124,auVar124,0xc9);
                auVar148._0_4_ = auVar288._0_4_ * auVar12._0_4_;
                auVar148._4_4_ = auVar288._4_4_ * auVar12._4_4_;
                auVar148._8_4_ = auVar288._8_4_ * auVar12._8_4_;
                auVar148._12_4_ = auVar288._12_4_ * auVar12._12_4_;
                auVar12 = vshufps_avx(auVar288,auVar288,0xc9);
                auVar288 = vfmsub231ps_fma(auVar148,auVar124,auVar12);
                auVar12 = vshufps_avx(auVar288,auVar288,0x55);
                local_208[0] = (RTCHitN)auVar12[0];
                local_208[1] = (RTCHitN)auVar12[1];
                local_208[2] = (RTCHitN)auVar12[2];
                local_208[3] = (RTCHitN)auVar12[3];
                local_208[4] = (RTCHitN)auVar12[4];
                local_208[5] = (RTCHitN)auVar12[5];
                local_208[6] = (RTCHitN)auVar12[6];
                local_208[7] = (RTCHitN)auVar12[7];
                local_208[8] = (RTCHitN)auVar12[8];
                local_208[9] = (RTCHitN)auVar12[9];
                local_208[10] = (RTCHitN)auVar12[10];
                local_208[0xb] = (RTCHitN)auVar12[0xb];
                local_208[0xc] = (RTCHitN)auVar12[0xc];
                local_208[0xd] = (RTCHitN)auVar12[0xd];
                local_208[0xe] = (RTCHitN)auVar12[0xe];
                local_208[0xf] = (RTCHitN)auVar12[0xf];
                local_1f8 = vshufps_avx(auVar288,auVar288,0xaa);
                local_1e8 = auVar288._0_4_;
                uStack_1e4 = local_1e8;
                uStack_1e0 = local_1e8;
                uStack_1dc = local_1e8;
                fStack_1d4 = local_1d8;
                fStack_1d0 = local_1d8;
                fStack_1cc = local_1d8;
                local_1b8 = CONCAT44(uStack_364,local_368);
                uStack_1b0 = CONCAT44(uStack_35c,uStack_360);
                local_1a8._4_4_ = uStack_354;
                local_1a8._0_4_ = local_358;
                local_1a8._8_4_ = uStack_350;
                local_1a8._12_4_ = uStack_34c;
                vpcmpeqd_avx2(ZEXT1632(local_1a8),ZEXT1632(local_1a8));
                uStack_194 = pRVar59->user->instID[0];
                local_198 = uStack_194;
                uStack_190 = uStack_194;
                uStack_18c = uStack_194;
                uStack_188 = pRVar59->user->instPrimID[0];
                uStack_184 = uStack_188;
                uStack_180 = uStack_188;
                uStack_17c = uStack_188;
                *(float *)(ray + k * 4 + 0x80) = fVar94;
                local_518 = *local_508;
                local_3d8.valid = (int *)local_518;
                local_3d8.geometryUserPtr = pGVar8->userPtr;
                local_3d8.context = pRVar59->user;
                local_3d8.ray = (RTCRayN *)ray;
                local_3d8.hit = local_208;
                local_3d8.N = 4;
                if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar230 = ZEXT1664(auVar13);
                  (*pGVar8->occlusionFilterN)(&local_3d8);
                }
                if (local_518 == (undefined1  [16])0x0) {
                  auVar12 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar12 = auVar12 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var9 = pRVar59->args->filter;
                  if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                     (((pRVar59->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar230 = ZEXT1664(auVar230._0_16_);
                    (*p_Var9)(&local_3d8);
                  }
                  auVar13 = vpcmpeqd_avx(local_518,_DAT_01f7aa10);
                  auVar12 = auVar13 ^ _DAT_01f7ae20;
                  auVar125._8_4_ = 0xff800000;
                  auVar125._0_8_ = 0xff800000ff800000;
                  auVar125._12_4_ = 0xff800000;
                  auVar13 = vblendvps_avx(auVar125,*(undefined1 (*) [16])(local_3d8.ray + 0x80),
                                          auVar13);
                  *(undefined1 (*) [16])(local_3d8.ray + 0x80) = auVar13;
                }
                auVar109._8_8_ = 0x100000001;
                auVar109._0_8_ = 0x100000001;
                bVar71 = (auVar109 & auVar12) != (undefined1  [16])0x0;
                if (!bVar71) {
                  *(float *)(ray + k * 4 + 0x80) = fVar74;
                }
              }
              bVar69 = (bool)(bVar69 | bVar71);
            }
          }
        }
        break;
      }
      lVar64 = lVar64 + -1;
    } while (lVar64 != 0);
    goto LAB_017ff334;
  }
  local_348 = vinsertps_avx(auVar12,ZEXT416((uint)fVar204),0x10);
  auVar77 = vinsertps_avx(auVar98,ZEXT416((uint)auVar99._0_4_),0x10);
  goto LAB_017fed8f;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }